

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  Primitive PVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [12];
  ulong uVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  byte bVar55;
  uint uVar56;
  ulong uVar57;
  long lVar58;
  ulong uVar59;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar60;
  uint uVar61;
  ulong uVar62;
  byte bVar63;
  bool bVar64;
  undefined4 uVar65;
  undefined8 uVar66;
  vint4 bi_2;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar72 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar92;
  float fVar121;
  float fVar122;
  vint4 bi_1;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar124;
  float fVar125;
  float fVar126;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar123;
  float fVar127;
  float fVar128;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar146;
  float fVar147;
  float fVar148;
  undefined1 auVar134 [32];
  float fVar145;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  vint4 ai_2;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  vint4 ai;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  float fVar191;
  float fVar204;
  float fVar205;
  vint4 bi;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  vint4 ai_1;
  undefined1 auVar221 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar237 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar250;
  undefined1 auVar251 [32];
  float fVar253;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  float fVar258;
  undefined1 auVar252 [64];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [32];
  undefined1 auVar262 [64];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [64];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_b4c;
  undefined1 local_b40 [8];
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  int local_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [16];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  RTCFilterFunctionNArguments local_9d0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_950;
  undefined4 local_948;
  float local_944;
  undefined4 local_940;
  undefined4 local_93c;
  uint local_938;
  uint local_934;
  uint local_930;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined1 local_7d0 [16];
  Primitive *local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar227 [64];
  undefined1 auVar234 [32];
  
  PVar4 = prim[1];
  uVar57 = (ulong)(byte)PVar4;
  local_7b8 = prim + uVar57 * 0x19 + 0x16;
  auVar9 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                      *(undefined1 (*) [16])(prim + uVar57 * 0x19 + 6));
  fVar92 = *(float *)(prim + uVar57 * 0x19 + 0x12);
  auVar67._0_4_ = fVar92 * auVar9._0_4_;
  auVar67._4_4_ = fVar92 * auVar9._4_4_;
  auVar67._8_4_ = fVar92 * auVar9._8_4_;
  auVar67._12_4_ = fVar92 * auVar9._12_4_;
  auVar192._0_4_ = fVar92 * (ray->dir).field_0.m128[0];
  auVar192._4_4_ = fVar92 * (ray->dir).field_0.m128[1];
  auVar192._8_4_ = fVar92 * (ray->dir).field_0.m128[2];
  auVar192._12_4_ = fVar92 * (ray->dir).field_0.m128[3];
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 4 + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 5 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 6 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xb + 6)));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xc + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar221 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0xd + 6)));
  auVar221 = vcvtdq2ps_avx(auVar221);
  auVar70 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x12 + 6)));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x13 + 6)));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar245 = ZEXT1664(auVar69);
  auVar130 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar57 * 0x14 + 6)));
  auVar130 = vcvtdq2ps_avx(auVar130);
  auVar259._4_4_ = auVar192._0_4_;
  auVar259._0_4_ = auVar192._0_4_;
  auVar259._8_4_ = auVar192._0_4_;
  auVar259._12_4_ = auVar192._0_4_;
  auVar94 = vshufps_avx(auVar192,auVar192,0x55);
  auVar68 = vshufps_avx(auVar192,auVar192,0xaa);
  fVar92 = auVar68._0_4_;
  auVar236._0_4_ = fVar92 * auVar179._0_4_;
  fVar121 = auVar68._4_4_;
  auVar236._4_4_ = fVar121 * auVar179._4_4_;
  fVar122 = auVar68._8_4_;
  auVar236._8_4_ = fVar122 * auVar179._8_4_;
  fVar123 = auVar68._12_4_;
  auVar236._12_4_ = fVar123 * auVar179._12_4_;
  auVar230._0_4_ = auVar221._0_4_ * fVar92;
  auVar230._4_4_ = auVar221._4_4_ * fVar121;
  auVar230._8_4_ = auVar221._8_4_ * fVar122;
  auVar230._12_4_ = auVar221._12_4_ * fVar123;
  auVar219._0_4_ = auVar130._0_4_ * fVar92;
  auVar219._4_4_ = auVar130._4_4_ * fVar121;
  auVar219._8_4_ = auVar130._8_4_ * fVar122;
  auVar219._12_4_ = auVar130._12_4_ * fVar123;
  auVar68 = vfmadd231ps_fma(auVar236,auVar94,auVar7);
  auVar95 = vfmadd231ps_fma(auVar230,auVar94,auVar78);
  auVar94 = vfmadd231ps_fma(auVar219,auVar69,auVar94);
  auVar149 = vfmadd231ps_fma(auVar68,auVar259,auVar9);
  auVar243 = ZEXT1664(auVar149);
  auVar95 = vfmadd231ps_fma(auVar95,auVar259,auVar74);
  auVar174 = vfmadd231ps_fma(auVar94,auVar70,auVar259);
  auVar260._4_4_ = auVar67._0_4_;
  auVar260._0_4_ = auVar67._0_4_;
  auVar260._8_4_ = auVar67._0_4_;
  auVar260._12_4_ = auVar67._0_4_;
  auVar94 = vshufps_avx(auVar67,auVar67,0x55);
  auVar68 = vshufps_avx(auVar67,auVar67,0xaa);
  fVar92 = auVar68._0_4_;
  auVar193._0_4_ = fVar92 * auVar179._0_4_;
  fVar121 = auVar68._4_4_;
  auVar193._4_4_ = fVar121 * auVar179._4_4_;
  fVar122 = auVar68._8_4_;
  auVar193._8_4_ = fVar122 * auVar179._8_4_;
  fVar123 = auVar68._12_4_;
  auVar193._12_4_ = fVar123 * auVar179._12_4_;
  auVar93._0_4_ = auVar221._0_4_ * fVar92;
  auVar93._4_4_ = auVar221._4_4_ * fVar121;
  auVar93._8_4_ = auVar221._8_4_ * fVar122;
  auVar93._12_4_ = auVar221._12_4_ * fVar123;
  auVar68._0_4_ = auVar130._0_4_ * fVar92;
  auVar68._4_4_ = auVar130._4_4_ * fVar121;
  auVar68._8_4_ = auVar130._8_4_ * fVar122;
  auVar68._12_4_ = auVar130._12_4_ * fVar123;
  auVar7 = vfmadd231ps_fma(auVar193,auVar94,auVar7);
  auVar179 = vfmadd231ps_fma(auVar93,auVar94,auVar78);
  auVar78 = vfmadd231ps_fma(auVar68,auVar94,auVar69);
  auVar221 = vfmadd231ps_fma(auVar7,auVar260,auVar9);
  auVar69 = vfmadd231ps_fma(auVar179,auVar260,auVar74);
  local_a20._8_4_ = 0x7fffffff;
  local_a20._0_8_ = 0x7fffffff7fffffff;
  local_a20._12_4_ = 0x7fffffff;
  auVar130 = vfmadd231ps_fma(auVar78,auVar260,auVar70);
  auVar9 = vandps_avx(auVar149,local_a20);
  auVar173._8_4_ = 0x219392ef;
  auVar173._0_8_ = 0x219392ef219392ef;
  auVar173._12_4_ = 0x219392ef;
  auVar9 = vcmpps_avx(auVar9,auVar173,1);
  auVar7 = vblendvps_avx(auVar149,auVar173,auVar9);
  auVar9 = vandps_avx(auVar95,local_a20);
  auVar9 = vcmpps_avx(auVar9,auVar173,1);
  auVar179 = vblendvps_avx(auVar95,auVar173,auVar9);
  auVar9 = vandps_avx(local_a20,auVar174);
  auVar9 = vcmpps_avx(auVar9,auVar173,1);
  auVar9 = vblendvps_avx(auVar174,auVar173,auVar9);
  auVar74 = vrcpps_avx(auVar7);
  auVar220._8_4_ = 0x3f800000;
  auVar220._0_8_ = 0x3f8000003f800000;
  auVar220._12_4_ = 0x3f800000;
  auVar7 = vfnmadd213ps_fma(auVar7,auVar74,auVar220);
  auVar74 = vfmadd132ps_fma(auVar7,auVar74,auVar74);
  auVar7 = vrcpps_avx(auVar179);
  auVar179 = vfnmadd213ps_fma(auVar179,auVar7,auVar220);
  auVar78 = vfmadd132ps_fma(auVar179,auVar7,auVar7);
  auVar7 = vrcpps_avx(auVar9);
  auVar9 = vfnmadd213ps_fma(auVar9,auVar7,auVar220);
  auVar70 = vfmadd132ps_fma(auVar9,auVar7,auVar7);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar57 * 7 + 6);
  auVar9 = vpmovsxwd_avx(auVar9);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar179 = vsubps_avx(auVar9,auVar221);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar57 * 9 + 6);
  auVar9 = vpmovsxwd_avx(auVar7);
  auVar174._0_4_ = auVar74._0_4_ * auVar179._0_4_;
  auVar174._4_4_ = auVar74._4_4_ * auVar179._4_4_;
  auVar174._8_4_ = auVar74._8_4_ * auVar179._8_4_;
  auVar174._12_4_ = auVar74._12_4_ * auVar179._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar221);
  auVar194._0_4_ = auVar74._0_4_ * auVar9._0_4_;
  auVar194._4_4_ = auVar74._4_4_ * auVar9._4_4_;
  auVar194._8_4_ = auVar74._8_4_ * auVar9._8_4_;
  auVar194._12_4_ = auVar74._12_4_ * auVar9._12_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar57 * 0xe + 6);
  auVar9 = vpmovsxwd_avx(auVar179);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar7 = vsubps_avx(auVar9,auVar69);
  auVar95._1_3_ = 0;
  auVar95[0] = PVar4;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar9 = vpmovsxwd_avx(auVar74);
  auVar210._0_4_ = auVar78._0_4_ * auVar7._0_4_;
  auVar210._4_4_ = auVar78._4_4_ * auVar7._4_4_;
  auVar210._8_4_ = auVar78._8_4_ * auVar7._8_4_;
  auVar210._12_4_ = auVar78._12_4_ * auVar7._12_4_;
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar69);
  auVar94._0_4_ = auVar78._0_4_ * auVar9._0_4_;
  auVar94._4_4_ = auVar78._4_4_ * auVar9._4_4_;
  auVar94._8_4_ = auVar78._8_4_ * auVar9._8_4_;
  auVar94._12_4_ = auVar78._12_4_ * auVar9._12_4_;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar57 * 0x15 + 6);
  auVar9 = vpmovsxwd_avx(auVar78);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar130);
  auVar149._0_4_ = auVar70._0_4_ * auVar9._0_4_;
  auVar149._4_4_ = auVar70._4_4_ * auVar9._4_4_;
  auVar149._8_4_ = auVar70._8_4_ * auVar9._8_4_;
  auVar149._12_4_ = auVar70._12_4_ * auVar9._12_4_;
  auVar221._8_8_ = 0;
  auVar221._0_8_ = *(ulong *)(prim + uVar57 * 0x17 + 6);
  auVar9 = vpmovsxwd_avx(auVar221);
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar9 = vsubps_avx(auVar9,auVar130);
  auVar69._0_4_ = auVar70._0_4_ * auVar9._0_4_;
  auVar69._4_4_ = auVar70._4_4_ * auVar9._4_4_;
  auVar69._8_4_ = auVar70._8_4_ * auVar9._8_4_;
  auVar69._12_4_ = auVar70._12_4_ * auVar9._12_4_;
  auVar9 = vpminsd_avx(auVar174,auVar194);
  auVar7 = vpminsd_avx(auVar210,auVar94);
  auVar9 = vmaxps_avx(auVar9,auVar7);
  auVar7 = vpminsd_avx(auVar149,auVar69);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar231._4_4_ = uVar1;
  auVar231._0_4_ = uVar1;
  auVar231._8_4_ = uVar1;
  auVar231._12_4_ = uVar1;
  auVar7 = vmaxps_avx(auVar7,auVar231);
  auVar9 = vmaxps_avx(auVar9,auVar7);
  local_520._0_4_ = auVar9._0_4_ * 0.99999964;
  local_520._4_4_ = auVar9._4_4_ * 0.99999964;
  local_520._8_4_ = auVar9._8_4_ * 0.99999964;
  local_520._12_4_ = auVar9._12_4_ * 0.99999964;
  auVar9 = vpmaxsd_avx(auVar174,auVar194);
  auVar7 = vpmaxsd_avx(auVar210,auVar94);
  auVar9 = vminps_avx(auVar9,auVar7);
  auVar7 = vpmaxsd_avx(auVar149,auVar69);
  fVar92 = ray->tfar;
  auVar130._4_4_ = fVar92;
  auVar130._0_4_ = fVar92;
  auVar130._8_4_ = fVar92;
  auVar130._12_4_ = fVar92;
  auVar7 = vminps_avx(auVar7,auVar130);
  auVar9 = vminps_avx(auVar9,auVar7);
  auVar70._0_4_ = auVar9._0_4_ * 1.0000004;
  auVar70._4_4_ = auVar9._4_4_ * 1.0000004;
  auVar70._8_4_ = auVar9._8_4_ * 1.0000004;
  auVar70._12_4_ = auVar9._12_4_ * 1.0000004;
  auVar95[4] = PVar4;
  auVar95._5_3_ = 0;
  auVar95[8] = PVar4;
  auVar95._9_3_ = 0;
  auVar95[0xc] = PVar4;
  auVar95._13_3_ = 0;
  auVar7 = vpcmpgtd_avx(auVar95,_DAT_01f4ad30);
  auVar9 = vcmpps_avx(local_520,auVar70,2);
  auVar9 = vandps_avx(auVar9,auVar7);
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  uVar60 = vmovmskps_avx(auVar9);
  local_340 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
LAB_010e9480:
  local_7a8 = (ulong)uVar60;
  if (local_7a8 == 0) {
LAB_010eb8dc:
    return local_7a8 != 0;
  }
  lVar58 = 0;
  for (uVar57 = local_7a8; (uVar57 & 1) == 0; uVar57 = uVar57 >> 1 | 0x8000000000000000) {
    lVar58 = lVar58 + 1;
  }
  local_7b0 = local_7a8 - 1 & local_7a8;
  uVar1 = *(undefined4 *)(prim + lVar58 * 4 + 6);
  uVar57 = (ulong)(uint)((int)lVar58 << 6);
  auVar9 = *(undefined1 (*) [16])(local_7b8 + uVar57);
  if (local_7b0 != 0) {
    uVar62 = local_7b0 - 1 & local_7b0;
    for (uVar59 = local_7b0; (uVar59 & 1) == 0; uVar59 = uVar59 >> 1 | 0x8000000000000000) {
    }
    if (uVar62 != 0) {
      for (; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = *(undefined1 (*) [16])(local_7b8 + uVar57 + 0x10);
  auVar179 = *(undefined1 (*) [16])(local_7b8 + uVar57 + 0x20);
  auVar74 = *(undefined1 (*) [16])(local_7b8 + uVar57 + 0x30);
  auVar195._0_4_ = (auVar9._0_4_ + auVar7._0_4_ + auVar179._0_4_ + auVar74._0_4_) * 0.25;
  auVar195._4_4_ = (auVar9._4_4_ + auVar7._4_4_ + auVar179._4_4_ + auVar74._4_4_) * 0.25;
  auVar195._8_4_ = (auVar9._8_4_ + auVar7._8_4_ + auVar179._8_4_ + auVar74._8_4_) * 0.25;
  auVar195._12_4_ = (auVar9._12_4_ + auVar7._12_4_ + auVar179._12_4_ + auVar74._12_4_) * 0.25;
  aVar2 = (ray->org).field_0;
  aVar3 = (ray->dir).field_0.field_1;
  auVar78 = vsubps_avx(auVar195,(undefined1  [16])aVar2);
  auVar78 = vdpps_avx(auVar78,(undefined1  [16])aVar3,0x7f);
  auVar221 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  uVar60 = *(uint *)(prim + 2);
  auVar70 = vrcpss_avx(auVar221,auVar221);
  auVar221 = vfnmadd213ss_fma(auVar70,auVar221,ZEXT416(0x40000000));
  fVar92 = auVar78._0_4_ * auVar70._0_4_ * auVar221._0_4_;
  local_7d0 = ZEXT416((uint)fVar92);
  auVar196._4_4_ = fVar92;
  auVar196._0_4_ = fVar92;
  auVar196._8_4_ = fVar92;
  auVar196._12_4_ = fVar92;
  fStack_650 = fVar92;
  _local_660 = auVar196;
  fStack_64c = fVar92;
  fStack_648 = fVar92;
  fStack_644 = fVar92;
  auVar78 = vfmadd231ps_fma((undefined1  [16])aVar2,(undefined1  [16])aVar3,auVar196);
  auVar78 = vblendps_avx(auVar78,_DAT_01f45a50,8);
  local_9e0 = vsubps_avx(auVar9,auVar78);
  local_9f0 = vsubps_avx(auVar179,auVar78);
  local_a00 = vsubps_avx(auVar7,auVar78);
  _local_a10 = vsubps_avx(auVar74,auVar78);
  auVar9 = vmovshdup_avx(local_9e0);
  local_1e0 = auVar9._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar9 = vshufps_avx(local_9e0,local_9e0,0xaa);
  uVar66 = auVar9._0_8_;
  auVar222._8_8_ = uVar66;
  auVar222._0_8_ = uVar66;
  auVar222._16_8_ = uVar66;
  auVar222._24_8_ = uVar66;
  auVar227 = ZEXT3264(auVar222);
  auVar9 = vshufps_avx(local_9e0,local_9e0,0xff);
  uVar66 = auVar9._0_8_;
  local_8e0._8_8_ = uVar66;
  local_8e0._0_8_ = uVar66;
  local_8e0._16_8_ = uVar66;
  local_8e0._24_8_ = uVar66;
  auVar229 = ZEXT3264(local_8e0);
  auVar9 = vmovshdup_avx(local_a00);
  local_200 = auVar9._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar9 = vshufps_avx(local_a00,local_a00,0xaa);
  uVar66 = auVar9._0_8_;
  local_900._8_8_ = uVar66;
  local_900._0_8_ = uVar66;
  local_900._16_8_ = uVar66;
  local_900._24_8_ = uVar66;
  auVar252 = ZEXT3264(local_900);
  auVar9 = vshufps_avx(local_a00,local_a00,0xff);
  uVar66 = auVar9._0_8_;
  local_860._8_8_ = uVar66;
  local_860._0_8_ = uVar66;
  local_860._16_8_ = uVar66;
  local_860._24_8_ = uVar66;
  auVar262 = ZEXT3264(local_860);
  auVar9 = vmovshdup_avx(local_9f0);
  uVar66 = auVar9._0_8_;
  local_a40._8_8_ = uVar66;
  local_a40._0_8_ = uVar66;
  local_a40._16_8_ = uVar66;
  local_a40._24_8_ = uVar66;
  auVar268 = ZEXT3264(local_a40);
  auVar7 = vshufps_avx(local_9f0,local_9f0,0xaa);
  uVar66 = auVar7._0_8_;
  auVar232._8_8_ = uVar66;
  auVar232._0_8_ = uVar66;
  auVar234._16_8_ = uVar66;
  auVar234._0_16_ = auVar232;
  auVar234._24_8_ = uVar66;
  auVar9 = vshufps_avx(local_9f0,local_9f0,0xff);
  local_440 = auVar9._0_4_;
  fStack_43c = auVar9._4_4_;
  auVar9 = vmovshdup_avx(_local_a10);
  local_220 = auVar9._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar9 = vshufps_avx(_local_a10,_local_a10,0xaa);
  local_240 = auVar9._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar9 = vshufps_avx(_local_a10,_local_a10,0xff);
  local_260 = auVar9._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar71._0_4_ = aVar3.x * aVar3.x;
  auVar71._4_4_ = aVar3.y * aVar3.y;
  auVar71._8_4_ = aVar3.z * aVar3.z;
  auVar71._12_4_ = aVar3.field_3.w * aVar3.field_3.w;
  auVar9 = vshufps_avx(auVar71,auVar71,0xaa);
  uVar66 = auVar9._0_8_;
  auVar109._8_8_ = uVar66;
  auVar109._0_8_ = uVar66;
  auVar109._16_8_ = uVar66;
  auVar109._24_8_ = uVar66;
  uVar65 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_540._4_4_ = uVar65;
  local_540._0_4_ = uVar65;
  local_540._8_4_ = uVar65;
  local_540._12_4_ = uVar65;
  local_540._16_4_ = uVar65;
  local_540._20_4_ = uVar65;
  local_540._24_4_ = uVar65;
  local_540._28_4_ = uVar65;
  auVar9 = vfmadd231ps_fma(auVar109,local_540,local_540);
  uVar65 = *(undefined4 *)&(ray->dir).field_0;
  local_560._4_4_ = uVar65;
  local_560._0_4_ = uVar65;
  fStack_558 = (float)uVar65;
  fStack_554 = (float)uVar65;
  fStack_550 = (float)uVar65;
  fStack_54c = (float)uVar65;
  fStack_548 = (float)uVar65;
  register0x0000121c = uVar65;
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_560,_local_560);
  uVar57 = 0;
  bVar63 = 0;
  local_b4c = 1;
  local_680 = (ray->dir).field_0.m128[2];
  uVar65 = local_9e0._0_4_;
  local_380._4_4_ = uVar65;
  local_380._0_4_ = uVar65;
  local_380._8_4_ = uVar65;
  local_380._12_4_ = uVar65;
  local_380._16_4_ = uVar65;
  local_380._20_4_ = uVar65;
  local_380._24_4_ = uVar65;
  local_380._28_4_ = uVar65;
  uVar65 = local_a00._0_4_;
  local_3a0._4_4_ = uVar65;
  local_3a0._0_4_ = uVar65;
  local_3a0._8_4_ = uVar65;
  local_3a0._12_4_ = uVar65;
  local_3a0._16_4_ = uVar65;
  local_3a0._20_4_ = uVar65;
  local_3a0._24_4_ = uVar65;
  local_3a0._28_4_ = uVar65;
  local_460 = local_9f0._0_4_;
  fStack_45c = local_460;
  fStack_458 = local_460;
  fStack_454 = local_460;
  fStack_450 = local_460;
  fStack_44c = local_460;
  fStack_448 = local_460;
  fStack_444 = local_460;
  local_3c0 = local_a10._0_4_;
  local_6a0._8_4_ = 0x7fffffff;
  local_6a0._0_8_ = 0x7fffffff7fffffff;
  local_6a0._12_4_ = 0x7fffffff;
  local_6a0._16_4_ = 0x7fffffff;
  local_6a0._20_4_ = 0x7fffffff;
  local_6a0._24_4_ = 0x7fffffff;
  local_6a0._28_4_ = 0x7fffffff;
  local_280 = ZEXT1632(auVar9);
  local_480 = vandps_avx(ZEXT1632(auVar9),local_6a0);
  local_510 = ZEXT816(0x3f80000000000000);
  local_360 = auVar222;
  fStack_3bc = local_3c0;
  fStack_3b8 = local_3c0;
  fStack_3b4 = local_3c0;
  fStack_3b0 = local_3c0;
  fStack_3ac = local_3c0;
  fStack_3a8 = local_3c0;
  fStack_3a4 = local_3c0;
  fStack_67c = local_680;
  fStack_678 = local_680;
  fStack_674 = local_680;
  fStack_670 = local_680;
  fStack_66c = local_680;
  fStack_668 = local_680;
  fStack_664 = local_680;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar9 = vmovshdup_avx(local_510);
    auVar9 = vsubps_avx(auVar9,local_510);
    fVar124 = auVar9._0_4_;
    fVar126 = fVar124 * 0.04761905;
    local_920._0_4_ = local_510._0_4_;
    local_920._4_4_ = local_920._0_4_;
    local_920._8_4_ = local_920._0_4_;
    local_920._12_4_ = local_920._0_4_;
    local_920._16_4_ = local_920._0_4_;
    local_920._20_4_ = local_920._0_4_;
    local_920._24_4_ = local_920._0_4_;
    local_920._28_4_ = local_920._0_4_;
    local_6e0._4_4_ = fVar124;
    local_6e0._0_4_ = fVar124;
    local_6e0._8_4_ = fVar124;
    local_6e0._12_4_ = fVar124;
    local_6e0._16_4_ = fVar124;
    local_6e0._20_4_ = fVar124;
    local_6e0._24_4_ = fVar124;
    local_6e0._28_4_ = fVar124;
    auVar9 = vfmadd231ps_fma(local_920,local_6e0,_DAT_01f7b040);
    auVar110._8_4_ = 0x3f800000;
    auVar110._0_8_ = 0x3f8000003f800000;
    auVar110._12_4_ = 0x3f800000;
    auVar110._16_4_ = 0x3f800000;
    auVar110._20_4_ = 0x3f800000;
    auVar110._24_4_ = 0x3f800000;
    auVar110._28_4_ = 0x3f800000;
    auVar108 = vsubps_avx(auVar110,ZEXT1632(auVar9));
    fVar92 = auVar9._0_4_;
    auVar246._0_4_ = local_3a0._0_4_ * fVar92;
    fVar121 = auVar9._4_4_;
    auVar246._4_4_ = local_3a0._4_4_ * fVar121;
    fVar122 = auVar9._8_4_;
    auVar246._8_4_ = local_3a0._8_4_ * fVar122;
    fVar123 = auVar9._12_4_;
    auVar246._12_4_ = local_3a0._12_4_ * fVar123;
    auVar246._16_4_ = local_3a0._16_4_ * 0.0;
    auVar246._20_4_ = local_3a0._20_4_ * 0.0;
    auVar246._28_36_ = auVar245._28_36_;
    auVar246._24_4_ = local_3a0._24_4_ * 0.0;
    auVar51._8_8_ = uStack_1f8;
    auVar51._0_8_ = local_200;
    auVar51._16_8_ = uStack_1f0;
    auVar51._24_8_ = uStack_1e8;
    auVar244._0_4_ = (float)local_200 * fVar92;
    auVar244._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar121;
    auVar244._8_4_ = (float)uStack_1f8 * fVar122;
    auVar244._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar123;
    auVar244._16_4_ = (float)uStack_1f0 * 0.0;
    auVar244._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar244._28_36_ = auVar243._28_36_;
    auVar244._24_4_ = (float)uStack_1e8 * 0.0;
    auVar243._0_4_ = auVar252._0_4_ * fVar92;
    auVar243._4_4_ = auVar252._4_4_ * fVar121;
    auVar243._8_4_ = auVar252._8_4_ * fVar122;
    auVar243._12_4_ = auVar252._12_4_ * fVar123;
    auVar243._16_4_ = auVar252._16_4_ * 0.0;
    auVar243._20_4_ = auVar252._20_4_ * 0.0;
    auVar243._28_36_ = auVar227._28_36_;
    auVar243._24_4_ = auVar252._24_4_ * 0.0;
    auVar115._4_4_ = auVar262._4_4_ * fVar121;
    auVar115._0_4_ = auVar262._0_4_ * fVar92;
    auVar115._8_4_ = auVar262._8_4_ * fVar122;
    auVar115._12_4_ = auVar262._12_4_ * fVar123;
    auVar115._16_4_ = auVar262._16_4_ * 0.0;
    auVar115._20_4_ = auVar262._20_4_ * 0.0;
    auVar115._24_4_ = auVar262._24_4_ * 0.0;
    auVar115._28_4_ = fVar124;
    auVar9 = vfmadd231ps_fma(auVar246._0_32_,auVar108,local_380);
    auVar52._8_8_ = uStack_1d8;
    auVar52._0_8_ = local_1e0;
    auVar52._16_8_ = uStack_1d0;
    auVar52._24_8_ = uStack_1c8;
    auVar179 = vfmadd231ps_fma(auVar244._0_32_,auVar108,auVar52);
    auVar74 = vfmadd231ps_fma(auVar243._0_32_,auVar108,auVar222);
    auVar78 = vfmadd231ps_fma(auVar115,auVar108,auVar229._0_32_);
    auVar245._0_4_ = fVar92 * local_460;
    auVar245._4_4_ = fVar121 * fStack_45c;
    auVar245._8_4_ = fVar122 * fStack_458;
    auVar245._12_4_ = fVar123 * fStack_454;
    auVar245._16_4_ = fStack_450 * 0.0;
    auVar245._20_4_ = fStack_44c * 0.0;
    auVar245._28_36_ = auVar229._28_36_;
    auVar245._24_4_ = fStack_448 * 0.0;
    auVar114._4_4_ = auVar268._4_4_ * fVar121;
    auVar114._0_4_ = auVar268._0_4_ * fVar92;
    auVar114._8_4_ = auVar268._8_4_ * fVar122;
    auVar114._12_4_ = auVar268._12_4_ * fVar123;
    auVar114._16_4_ = auVar268._16_4_ * 0.0;
    auVar114._20_4_ = auVar268._20_4_ * 0.0;
    auVar114._24_4_ = auVar268._24_4_ * 0.0;
    auVar114._28_4_ = local_380._28_4_;
    fVar124 = auVar7._0_4_;
    fVar125 = auVar7._4_4_;
    auVar167._4_4_ = fVar125 * fVar121;
    auVar167._0_4_ = fVar124 * fVar92;
    auVar167._8_4_ = fVar124 * fVar122;
    auVar167._12_4_ = fVar125 * fVar123;
    auVar167._16_4_ = fVar124 * 0.0;
    auVar167._20_4_ = fVar125 * 0.0;
    auVar167._24_4_ = fVar124 * 0.0;
    auVar167._28_4_ = auVar222._28_4_;
    auVar137._4_4_ = fVar121 * fStack_43c;
    auVar137._0_4_ = fVar92 * local_440;
    auVar137._8_4_ = fVar122 * fStack_438;
    auVar137._12_4_ = fVar123 * fStack_434;
    auVar137._16_4_ = fStack_430 * 0.0;
    auVar137._20_4_ = fStack_42c * 0.0;
    uVar65 = (undefined4)((ulong)uStack_1e8 >> 0x20);
    auVar137._24_4_ = fStack_428 * 0.0;
    auVar137._28_4_ = uVar65;
    auVar221 = vfmadd231ps_fma(auVar245._0_32_,auVar108,local_3a0);
    auVar70 = vfmadd231ps_fma(auVar114,auVar108,auVar51);
    auVar69 = vfmadd231ps_fma(auVar167,auVar108,auVar252._0_32_);
    auVar130 = vfmadd231ps_fma(auVar137,auVar108,auVar262._0_32_);
    auVar187._4_4_ = fStack_3bc * fVar121;
    auVar187._0_4_ = local_3c0 * fVar92;
    auVar187._8_4_ = fStack_3b8 * fVar122;
    auVar187._12_4_ = fStack_3b4 * fVar123;
    auVar187._16_4_ = fStack_3b0 * 0.0;
    auVar187._20_4_ = fStack_3ac * 0.0;
    auVar187._24_4_ = fStack_3a8 * 0.0;
    auVar187._28_4_ = uVar65;
    auVar11._4_4_ = fVar121 * local_220._4_4_;
    auVar11._0_4_ = fVar92 * (float)local_220;
    auVar11._8_4_ = fVar122 * (float)uStack_218;
    auVar11._12_4_ = fVar123 * uStack_218._4_4_;
    auVar11._16_4_ = (float)uStack_210 * 0.0;
    auVar11._20_4_ = uStack_210._4_4_ * 0.0;
    auVar11._24_4_ = (float)uStack_208 * 0.0;
    auVar11._28_4_ = fStack_3a4;
    auVar54._28_4_ = fVar125;
    auVar54._0_28_ =
         ZEXT1628(CONCAT412(auVar221._12_4_ * fVar123,
                            CONCAT48(auVar221._8_4_ * fVar122,
                                     CONCAT44(auVar221._4_4_ * fVar121,auVar221._0_4_ * fVar92))));
    auVar9 = vfmadd231ps_fma(auVar54,auVar108,ZEXT1632(auVar9));
    auVar179 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar70._12_4_,
                                                  CONCAT48(fVar122 * auVar70._8_4_,
                                                           CONCAT44(fVar121 * auVar70._4_4_,
                                                                    fVar92 * auVar70._0_4_)))),
                               auVar108,ZEXT1632(auVar179));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar69._12_4_,
                                                 CONCAT48(fVar122 * auVar69._8_4_,
                                                          CONCAT44(fVar121 * auVar69._4_4_,
                                                                   fVar92 * auVar69._0_4_)))),
                              auVar108,ZEXT1632(auVar74));
    auVar12._28_4_ = local_3a0._28_4_;
    auVar12._0_28_ =
         ZEXT1628(CONCAT412(fVar123 * auVar130._12_4_,
                            CONCAT48(fVar122 * auVar130._8_4_,
                                     CONCAT44(fVar121 * auVar130._4_4_,fVar92 * auVar130._0_4_))));
    auVar78 = vfmadd231ps_fma(auVar12,auVar108,ZEXT1632(auVar78));
    auVar223._0_4_ = fVar92 * (float)local_240;
    auVar223._4_4_ = fVar121 * local_240._4_4_;
    auVar223._8_4_ = fVar122 * (float)uStack_238;
    auVar223._12_4_ = fVar123 * uStack_238._4_4_;
    auVar223._16_4_ = (float)uStack_230 * 0.0;
    auVar223._20_4_ = uStack_230._4_4_ * 0.0;
    auVar223._24_4_ = (float)uStack_228 * 0.0;
    auVar223._28_4_ = 0;
    auVar182._4_4_ = fStack_45c;
    auVar182._0_4_ = local_460;
    auVar182._8_4_ = fStack_458;
    auVar182._12_4_ = fStack_454;
    auVar182._16_4_ = fStack_450;
    auVar182._20_4_ = fStack_44c;
    auVar182._24_4_ = fStack_448;
    auVar182._28_4_ = fStack_444;
    auVar94 = vfmadd231ps_fma(auVar187,auVar108,auVar182);
    auVar221 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar123,
                                                  CONCAT48(auVar94._8_4_ * fVar122,
                                                           CONCAT44(auVar94._4_4_ * fVar121,
                                                                    auVar94._0_4_ * fVar92)))),
                               auVar108,ZEXT1632(auVar221));
    auVar228._0_4_ = fVar92 * (float)local_260;
    auVar228._4_4_ = fVar121 * local_260._4_4_;
    auVar228._8_4_ = fVar122 * (float)uStack_258;
    auVar228._12_4_ = fVar123 * uStack_258._4_4_;
    auVar228._16_4_ = (float)uStack_250 * 0.0;
    auVar228._20_4_ = uStack_250._4_4_ * 0.0;
    auVar228._24_4_ = (float)uStack_248 * 0.0;
    auVar228._28_4_ = 0;
    auVar94 = vfmadd231ps_fma(auVar11,auVar108,auVar268._0_32_);
    auVar68 = vfmadd231ps_fma(auVar223,auVar108,auVar234);
    auVar48._4_4_ = fStack_43c;
    auVar48._0_4_ = local_440;
    auVar48._8_4_ = fStack_438;
    auVar48._12_4_ = fStack_434;
    auVar48._16_4_ = fStack_430;
    auVar48._20_4_ = fStack_42c;
    auVar48._24_4_ = fStack_428;
    auVar48._28_4_ = fStack_424;
    auVar95 = vfmadd231ps_fma(auVar228,auVar108,auVar48);
    auVar164._28_4_ = fVar125;
    auVar164._0_28_ =
         ZEXT1628(CONCAT412(auVar95._12_4_ * fVar123,
                            CONCAT48(auVar95._8_4_ * fVar122,
                                     CONCAT44(auVar95._4_4_ * fVar121,auVar95._0_4_ * fVar92))));
    auVar70 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar94._12_4_ * fVar123,
                                                 CONCAT48(auVar94._8_4_ * fVar122,
                                                          CONCAT44(auVar94._4_4_ * fVar121,
                                                                   auVar94._0_4_ * fVar92)))),
                              auVar108,ZEXT1632(auVar70));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar68._12_4_,
                                                 CONCAT48(fVar122 * auVar68._8_4_,
                                                          CONCAT44(fVar121 * auVar68._4_4_,
                                                                   fVar92 * auVar68._0_4_)))),
                              auVar108,ZEXT1632(auVar69));
    auVar130 = vfmadd231ps_fma(auVar164,auVar108,ZEXT1632(auVar130));
    auVar227._28_36_ = auVar268._28_36_;
    auVar227._0_28_ =
         ZEXT1628(CONCAT412(auVar70._12_4_ * fVar123,
                            CONCAT48(auVar70._8_4_ * fVar122,
                                     CONCAT44(auVar70._4_4_ * fVar121,auVar70._0_4_ * fVar92))));
    auVar94 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar221._12_4_ * fVar123,
                                                 CONCAT48(auVar221._8_4_ * fVar122,
                                                          CONCAT44(auVar221._4_4_ * fVar121,
                                                                   auVar221._0_4_ * fVar92)))),
                              auVar108,ZEXT1632(auVar9));
    auVar68 = vfmadd231ps_fma(auVar227._0_32_,auVar108,ZEXT1632(auVar179));
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar123 * auVar69._12_4_,
                                                 CONCAT48(fVar122 * auVar69._8_4_,
                                                          CONCAT44(fVar121 * auVar69._4_4_,
                                                                   fVar92 * auVar69._0_4_)))),
                              auVar108,ZEXT1632(auVar74));
    auVar149 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar130._12_4_ * fVar123,
                                                  CONCAT48(auVar130._8_4_ * fVar122,
                                                           CONCAT44(auVar130._4_4_ * fVar121,
                                                                    auVar130._0_4_ * fVar92)))),
                               ZEXT1632(auVar78),auVar108);
    auVar222 = vsubps_avx(ZEXT1632(auVar221),ZEXT1632(auVar9));
    auVar108 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar179));
    auVar109 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar74));
    auVar115 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar78));
    fVar191 = fVar126 * auVar222._0_4_ * 3.0;
    fVar204 = fVar126 * auVar222._4_4_ * 3.0;
    local_6c0._4_4_ = fVar204;
    local_6c0._0_4_ = fVar191;
    fVar205 = fVar126 * auVar222._8_4_ * 3.0;
    local_6c0._8_4_ = fVar205;
    fVar206 = fVar126 * auVar222._12_4_ * 3.0;
    local_6c0._12_4_ = fVar206;
    fVar207 = fVar126 * auVar222._16_4_ * 3.0;
    local_6c0._16_4_ = fVar207;
    fVar208 = fVar126 * auVar222._20_4_ * 3.0;
    local_6c0._20_4_ = fVar208;
    fVar209 = fVar126 * auVar222._24_4_ * 3.0;
    local_6c0._24_4_ = fVar209;
    local_6c0._28_4_ = 0x40400000;
    local_9a0._0_4_ = fVar126 * auVar108._0_4_ * 3.0;
    local_9a0._4_4_ = fVar126 * auVar108._4_4_ * 3.0;
    local_9a0._8_4_ = fVar126 * auVar108._8_4_ * 3.0;
    local_9a0._12_4_ = fVar126 * auVar108._12_4_ * 3.0;
    local_9a0._16_4_ = fVar126 * auVar108._16_4_ * 3.0;
    local_9a0._20_4_ = fVar126 * auVar108._20_4_ * 3.0;
    local_9a0._24_4_ = fVar126 * auVar108._24_4_ * 3.0;
    local_9a0._28_4_ = 0;
    local_a60._0_4_ = fVar126 * auVar109._0_4_ * 3.0;
    local_a60._4_4_ = fVar126 * auVar109._4_4_ * 3.0;
    local_a60._8_4_ = fVar126 * auVar109._8_4_ * 3.0;
    local_a60._12_4_ = fVar126 * auVar109._12_4_ * 3.0;
    local_a60._16_4_ = fVar126 * auVar109._16_4_ * 3.0;
    local_a60._20_4_ = fVar126 * auVar109._20_4_ * 3.0;
    local_a60._24_4_ = fVar126 * auVar109._24_4_ * 3.0;
    local_a60._28_4_ = 0;
    fVar92 = fVar126 * auVar115._0_4_ * 3.0;
    fVar121 = fVar126 * auVar115._4_4_ * 3.0;
    auVar224._4_4_ = fVar121;
    auVar224._0_4_ = fVar92;
    fVar122 = fVar126 * auVar115._8_4_ * 3.0;
    auVar224._8_4_ = fVar122;
    fVar123 = fVar126 * auVar115._12_4_ * 3.0;
    auVar224._12_4_ = fVar123;
    fVar124 = fVar126 * auVar115._16_4_ * 3.0;
    auVar224._16_4_ = fVar124;
    fVar125 = fVar126 * auVar115._20_4_ * 3.0;
    auVar224._20_4_ = fVar125;
    fVar126 = fVar126 * auVar115._24_4_ * 3.0;
    auVar224._24_4_ = fVar126;
    auVar224._28_4_ = auVar222._28_4_;
    auVar182 = ZEXT1632(auVar94);
    auVar11 = vpermps_avx2(_DAT_01fb7720,auVar182);
    _local_800 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar68));
    local_980 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar95));
    local_2a0 = vsubps_avx(auVar11,ZEXT1632(auVar94));
    auVar114 = vsubps_avx(local_980,ZEXT1632(auVar95));
    auVar164 = ZEXT1632(auVar95);
    fVar127 = auVar114._0_4_;
    fVar128 = auVar114._4_4_;
    auVar135._4_4_ = fVar128 * fVar204;
    auVar135._0_4_ = fVar127 * fVar191;
    fVar191 = auVar114._8_4_;
    auVar135._8_4_ = fVar191 * fVar205;
    fVar204 = auVar114._12_4_;
    auVar135._12_4_ = fVar204 * fVar206;
    fVar205 = auVar114._16_4_;
    auVar135._16_4_ = fVar205 * fVar207;
    fVar206 = auVar114._20_4_;
    auVar135._20_4_ = fVar206 * fVar208;
    fVar207 = auVar114._24_4_;
    auVar135._24_4_ = fVar207 * fVar209;
    auVar135._28_4_ = local_980._28_4_;
    auVar9 = vfmsub231ps_fma(auVar135,local_a60,local_2a0);
    local_2c0 = vsubps_avx(_local_800,ZEXT1632(auVar68));
    fVar250 = local_2a0._0_4_;
    fVar253 = local_2a0._4_4_;
    auVar261._4_4_ = fVar253 * local_9a0._4_4_;
    auVar261._0_4_ = fVar250 * (float)local_9a0._0_4_;
    fVar254 = local_2a0._8_4_;
    auVar261._8_4_ = fVar254 * local_9a0._8_4_;
    fVar255 = local_2a0._12_4_;
    auVar261._12_4_ = fVar255 * local_9a0._12_4_;
    fVar256 = local_2a0._16_4_;
    auVar261._16_4_ = fVar256 * local_9a0._16_4_;
    fVar257 = local_2a0._20_4_;
    auVar261._20_4_ = fVar257 * local_9a0._20_4_;
    fVar258 = local_2a0._24_4_;
    auVar261._24_4_ = fVar258 * local_9a0._24_4_;
    auVar261._28_4_ = auVar11._28_4_;
    auVar179 = vfmsub231ps_fma(auVar261,local_6c0,local_2c0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar179._12_4_ * auVar179._12_4_,
                                                CONCAT48(auVar179._8_4_ * auVar179._8_4_,
                                                         CONCAT44(auVar179._4_4_ * auVar179._4_4_,
                                                                  auVar179._0_4_ * auVar179._0_4_)))
                                     ),ZEXT1632(auVar9),ZEXT1632(auVar9));
    auVar134._0_4_ = fVar127 * fVar127;
    auVar134._4_4_ = fVar128 * fVar128;
    auVar134._8_4_ = fVar191 * fVar191;
    auVar134._12_4_ = fVar204 * fVar204;
    auVar134._16_4_ = fVar205 * fVar205;
    auVar134._20_4_ = fVar206 * fVar206;
    auVar134._24_4_ = fVar207 * fVar207;
    auVar134._28_4_ = 0;
    auVar179 = vfmadd231ps_fma(auVar134,local_2c0,local_2c0);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar179),local_2a0,local_2a0);
    fVar208 = local_2c0._0_4_;
    auVar165._0_4_ = fVar208 * (float)local_a60._0_4_;
    fVar209 = local_2c0._4_4_;
    auVar165._4_4_ = fVar209 * local_a60._4_4_;
    fVar145 = local_2c0._8_4_;
    auVar165._8_4_ = fVar145 * local_a60._8_4_;
    fVar146 = local_2c0._12_4_;
    auVar165._12_4_ = fVar146 * local_a60._12_4_;
    fVar147 = local_2c0._16_4_;
    auVar165._16_4_ = fVar147 * local_a60._16_4_;
    fVar148 = local_2c0._20_4_;
    auVar165._20_4_ = fVar148 * local_a60._20_4_;
    fVar170 = local_2c0._24_4_;
    auVar165._24_4_ = fVar170 * local_a60._24_4_;
    auVar165._28_4_ = 0;
    auVar108 = vrcpps_avx(ZEXT1632(auVar179));
    auVar74 = vfmsub231ps_fma(auVar165,local_9a0,auVar114);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632(auVar74),ZEXT1632(auVar74));
    auVar247._8_4_ = 0x3f800000;
    auVar247._0_8_ = 0x3f8000003f800000;
    auVar247._12_4_ = 0x3f800000;
    auVar247._16_4_ = 0x3f800000;
    auVar247._20_4_ = 0x3f800000;
    auVar247._24_4_ = 0x3f800000;
    auVar247._28_4_ = 0x3f800000;
    auVar9 = vfnmadd213ps_fma(auVar108,ZEXT1632(auVar179),auVar247);
    auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar108,auVar108);
    local_a80 = vpermps_avx2(_DAT_01fb7720,local_6c0);
    local_820 = vpermps_avx2(_DAT_01fb7720,local_a60);
    auVar263._4_4_ = local_a80._4_4_ * fVar128;
    auVar263._0_4_ = local_a80._0_4_ * fVar127;
    auVar263._8_4_ = local_a80._8_4_ * fVar191;
    auVar263._12_4_ = local_a80._12_4_ * fVar204;
    auVar263._16_4_ = local_a80._16_4_ * fVar205;
    auVar263._20_4_ = local_a80._20_4_ * fVar206;
    auVar263._24_4_ = local_a80._24_4_ * fVar207;
    auVar263._28_4_ = auVar108._28_4_;
    auVar78 = vfmsub231ps_fma(auVar263,local_820,local_2a0);
    local_840 = vpermps_avx2(_DAT_01fb7720,local_9a0);
    auVar8._4_4_ = fVar253 * local_840._4_4_;
    auVar8._0_4_ = fVar250 * local_840._0_4_;
    auVar8._8_4_ = fVar254 * local_840._8_4_;
    auVar8._12_4_ = fVar255 * local_840._12_4_;
    auVar8._16_4_ = fVar256 * local_840._16_4_;
    auVar8._20_4_ = fVar257 * local_840._20_4_;
    auVar8._24_4_ = fVar258 * local_840._24_4_;
    auVar8._28_4_ = 0x40400000;
    auVar221 = vfmsub231ps_fma(auVar8,local_a80,local_2c0);
    auVar78 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar221._12_4_ * auVar221._12_4_,
                                                 CONCAT48(auVar221._8_4_ * auVar221._8_4_,
                                                          CONCAT44(auVar221._4_4_ * auVar221._4_4_,
                                                                   auVar221._0_4_ * auVar221._0_4_))
                                                )),ZEXT1632(auVar78),ZEXT1632(auVar78));
    auVar183._0_4_ = fVar208 * local_820._0_4_;
    auVar183._4_4_ = fVar209 * local_820._4_4_;
    auVar183._8_4_ = fVar145 * local_820._8_4_;
    auVar183._12_4_ = fVar146 * local_820._12_4_;
    auVar183._16_4_ = fVar147 * local_820._16_4_;
    auVar183._20_4_ = fVar148 * local_820._20_4_;
    auVar183._24_4_ = fVar170 * local_820._24_4_;
    auVar183._28_4_ = 0;
    auVar221 = vfmsub231ps_fma(auVar183,local_840,auVar114);
    auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),ZEXT1632(auVar221),ZEXT1632(auVar221));
    auVar108 = vmaxps_avx(ZEXT1632(CONCAT412(auVar74._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar74._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar74._4_4_ * auVar9._4_4_,
                                                               auVar74._0_4_ * auVar9._0_4_)))),
                          ZEXT1632(CONCAT412(auVar78._12_4_ * auVar9._12_4_,
                                             CONCAT48(auVar78._8_4_ * auVar9._8_4_,
                                                      CONCAT44(auVar78._4_4_ * auVar9._4_4_,
                                                               auVar78._0_4_ * auVar9._0_4_)))));
    local_720._0_4_ = auVar149._0_4_ + fVar92;
    local_720._4_4_ = auVar149._4_4_ + fVar121;
    local_720._8_4_ = auVar149._8_4_ + fVar122;
    local_720._12_4_ = auVar149._12_4_ + fVar123;
    local_720._16_4_ = fVar124 + 0.0;
    local_720._20_4_ = fVar125 + 0.0;
    local_720._24_4_ = fVar126 + 0.0;
    local_720._28_4_ = auVar222._28_4_ + 0.0;
    local_700 = ZEXT1632(auVar149);
    auVar222 = vsubps_avx(local_700,auVar224);
    local_740 = vpermps_avx2(_DAT_01fb7720,auVar222);
    auVar12 = vpermps_avx2(_DAT_01fb7720,local_700);
    auVar222 = vmaxps_avx(local_700,local_720);
    auVar115 = vrsqrtps_avx(ZEXT1632(auVar179));
    auVar109 = vmaxps_avx(local_740,auVar12);
    auVar222 = vmaxps_avx(auVar222,auVar109);
    fVar92 = auVar115._0_4_;
    fVar121 = auVar115._4_4_;
    fVar122 = auVar115._8_4_;
    fVar123 = auVar115._12_4_;
    fVar126 = auVar115._16_4_;
    fVar124 = auVar115._20_4_;
    fVar125 = auVar115._24_4_;
    auVar53._4_4_ = fVar121 * fVar121 * fVar121 * auVar179._4_4_ * -0.5;
    auVar53._0_4_ = fVar92 * fVar92 * fVar92 * auVar179._0_4_ * -0.5;
    auVar53._8_4_ = fVar122 * fVar122 * fVar122 * auVar179._8_4_ * -0.5;
    auVar53._12_4_ = fVar123 * fVar123 * fVar123 * auVar179._12_4_ * -0.5;
    auVar53._16_4_ = fVar126 * fVar126 * fVar126 * -0.0;
    auVar53._20_4_ = fVar124 * fVar124 * fVar124 * -0.0;
    auVar53._24_4_ = fVar125 * fVar125 * fVar125 * -0.0;
    auVar53._28_4_ = DAT_01fb7720._28_4_;
    auVar82._8_4_ = 0x3fc00000;
    auVar82._0_8_ = 0x3fc000003fc00000;
    auVar82._12_4_ = 0x3fc00000;
    auVar82._16_4_ = 0x3fc00000;
    auVar82._20_4_ = 0x3fc00000;
    auVar82._24_4_ = 0x3fc00000;
    auVar82._28_4_ = 0x3fc00000;
    auVar9 = vfmadd231ps_fma(auVar53,auVar82,auVar115);
    fVar121 = auVar9._0_4_;
    fVar122 = auVar9._4_4_;
    auVar10._4_4_ = fVar209 * fVar122;
    auVar10._0_4_ = fVar208 * fVar121;
    fVar126 = auVar9._8_4_;
    auVar10._8_4_ = fVar145 * fVar126;
    fVar125 = auVar9._12_4_;
    auVar10._12_4_ = fVar146 * fVar125;
    auVar10._16_4_ = fVar147 * 0.0;
    auVar10._20_4_ = fVar148 * 0.0;
    auVar10._24_4_ = fVar170 * 0.0;
    auVar10._28_4_ = 0x3fc00000;
    auVar14._4_4_ = fStack_67c * fVar128 * fVar122;
    auVar14._0_4_ = local_680 * fVar127 * fVar121;
    auVar14._8_4_ = fStack_678 * fVar191 * fVar126;
    auVar14._12_4_ = fStack_674 * fVar204 * fVar125;
    auVar14._16_4_ = fStack_670 * fVar205 * 0.0;
    auVar14._20_4_ = fStack_66c * fVar206 * 0.0;
    auVar14._24_4_ = fStack_668 * fVar207 * 0.0;
    auVar14._28_4_ = auVar114._28_4_;
    auVar179 = vfmadd231ps_fma(auVar14,auVar10,local_540);
    auVar109 = vsubps_avx(ZEXT832(0) << 0x20,auVar164);
    fVar145 = auVar109._0_4_;
    fVar146 = auVar109._4_4_;
    auVar15._4_4_ = fVar146 * fVar128 * fVar122;
    auVar15._0_4_ = fVar145 * fVar127 * fVar121;
    fVar147 = auVar109._8_4_;
    auVar15._8_4_ = fVar147 * fVar191 * fVar126;
    fVar148 = auVar109._12_4_;
    auVar15._12_4_ = fVar148 * fVar204 * fVar125;
    fVar170 = auVar109._16_4_;
    auVar15._16_4_ = fVar170 * fVar205 * 0.0;
    fVar171 = auVar109._20_4_;
    auVar15._20_4_ = fVar171 * fVar206 * 0.0;
    fVar172 = auVar109._24_4_;
    auVar15._24_4_ = fVar172 * fVar207 * 0.0;
    auVar15._28_4_ = 0;
    auVar263 = ZEXT1632(auVar68);
    auVar115 = vsubps_avx(ZEXT832(0) << 0x20,auVar263);
    auVar74 = vfmadd231ps_fma(auVar15,auVar115,auVar10);
    local_880 = ZEXT1632(auVar9);
    auVar16._4_4_ = fVar253 * fVar122;
    auVar16._0_4_ = fVar250 * fVar121;
    auVar16._8_4_ = fVar254 * fVar126;
    auVar16._12_4_ = fVar255 * fVar125;
    auVar16._16_4_ = fVar256 * 0.0;
    auVar16._20_4_ = fVar257 * 0.0;
    auVar16._24_4_ = fVar258 * 0.0;
    auVar16._28_4_ = 0x3fc00000;
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar179),auVar16,_local_560);
    auVar227 = ZEXT1664(auVar9);
    auVar135 = ZEXT832(0) << 0x20;
    auVar167 = vsubps_avx(auVar135,auVar182);
    auVar179 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar167,auVar16);
    auVar17._4_4_ = fStack_67c * fVar146;
    auVar17._0_4_ = local_680 * fVar145;
    auVar17._8_4_ = fStack_678 * fVar147;
    auVar17._12_4_ = fStack_674 * fVar148;
    auVar17._16_4_ = fStack_670 * fVar170;
    auVar17._20_4_ = fStack_66c * fVar171;
    auVar17._24_4_ = fStack_668 * fVar172;
    auVar17._28_4_ = 0x3fc00000;
    auVar74 = vfmadd231ps_fma(auVar17,local_540,auVar115);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),_local_560,auVar167);
    fVar92 = auVar9._0_4_;
    fVar204 = auVar179._0_4_;
    fVar123 = auVar9._4_4_;
    fVar205 = auVar179._4_4_;
    fVar124 = auVar9._8_4_;
    fVar206 = auVar179._8_4_;
    fVar191 = auVar9._12_4_;
    fVar207 = auVar179._12_4_;
    auVar18._28_4_ = local_540._28_4_;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * fVar191,
                            CONCAT48(fVar206 * fVar124,CONCAT44(fVar205 * fVar123,fVar204 * fVar92))
                           ));
    auVar137 = vsubps_avx(ZEXT1632(auVar74),auVar18);
    auVar19._4_4_ = fVar146 * fVar146;
    auVar19._0_4_ = fVar145 * fVar145;
    auVar19._8_4_ = fVar147 * fVar147;
    auVar19._12_4_ = fVar148 * fVar148;
    auVar19._16_4_ = fVar170 * fVar170;
    auVar19._20_4_ = fVar171 * fVar171;
    auVar19._24_4_ = fVar172 * fVar172;
    auVar19._28_4_ = local_540._28_4_;
    auVar74 = vfmadd231ps_fma(auVar19,auVar115,auVar115);
    auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar167,auVar167);
    auVar261 = ZEXT1632(auVar179);
    auVar20._28_4_ = local_560._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar207 * fVar207,
                            CONCAT48(fVar206 * fVar206,CONCAT44(fVar205 * fVar205,fVar204 * fVar204)
                                    )));
    auVar187 = vsubps_avx(ZEXT1632(auVar74),auVar20);
    auVar108 = vsqrtps_avx(auVar108);
    fVar128 = auVar108._28_4_ + auVar222._28_4_;
    fVar204 = (auVar108._0_4_ + auVar222._0_4_) * 1.0000002;
    fVar205 = (auVar108._4_4_ + auVar222._4_4_) * 1.0000002;
    fVar206 = (auVar108._8_4_ + auVar222._8_4_) * 1.0000002;
    fVar207 = (auVar108._12_4_ + auVar222._12_4_) * 1.0000002;
    fVar208 = (auVar108._16_4_ + auVar222._16_4_) * 1.0000002;
    fVar209 = (auVar108._20_4_ + auVar222._20_4_) * 1.0000002;
    fVar127 = (auVar108._24_4_ + auVar222._24_4_) * 1.0000002;
    auVar21._4_4_ = fVar205 * fVar205;
    auVar21._0_4_ = fVar204 * fVar204;
    auVar21._8_4_ = fVar206 * fVar206;
    auVar21._12_4_ = fVar207 * fVar207;
    auVar21._16_4_ = fVar208 * fVar208;
    auVar21._20_4_ = fVar209 * fVar209;
    auVar21._24_4_ = fVar127 * fVar127;
    auVar21._28_4_ = fVar128;
    fVar208 = auVar137._0_4_ + auVar137._0_4_;
    fVar209 = auVar137._4_4_ + auVar137._4_4_;
    local_300._0_8_ = CONCAT44(fVar209,fVar208);
    local_300._8_4_ = auVar137._8_4_ + auVar137._8_4_;
    local_300._12_4_ = auVar137._12_4_ + auVar137._12_4_;
    local_300._16_4_ = auVar137._16_4_ + auVar137._16_4_;
    local_300._20_4_ = auVar137._20_4_ + auVar137._20_4_;
    local_300._24_4_ = auVar137._24_4_ + auVar137._24_4_;
    local_300._28_4_ = auVar137._28_4_ + auVar137._28_4_;
    auVar222 = vsubps_avx(auVar187,auVar21);
    local_2e0._28_4_ = local_a80._28_4_;
    local_2e0._0_28_ =
         ZEXT1628(CONCAT412(fVar191 * fVar191,
                            CONCAT48(fVar124 * fVar124,CONCAT44(fVar123 * fVar123,fVar92 * fVar92)))
                 );
    local_620 = vsubps_avx(local_280,local_2e0);
    auVar22._4_4_ = fVar209 * fVar209;
    auVar22._0_4_ = fVar208 * fVar208;
    auVar22._8_4_ = local_300._8_4_ * local_300._8_4_;
    auVar22._12_4_ = local_300._12_4_ * local_300._12_4_;
    auVar22._16_4_ = local_300._16_4_ * local_300._16_4_;
    auVar22._20_4_ = local_300._20_4_ * local_300._20_4_;
    auVar22._24_4_ = local_300._24_4_ * local_300._24_4_;
    auVar22._28_4_ = fVar128;
    fVar123 = local_620._0_4_;
    fVar124 = local_620._4_4_;
    fVar191 = local_620._8_4_;
    fVar204 = local_620._12_4_;
    fVar205 = local_620._16_4_;
    fVar206 = local_620._20_4_;
    fVar207 = local_620._24_4_;
    auVar23._4_4_ = fVar124 * 4.0 * auVar222._4_4_;
    auVar23._0_4_ = fVar123 * 4.0 * auVar222._0_4_;
    auVar23._8_4_ = fVar191 * 4.0 * auVar222._8_4_;
    auVar23._12_4_ = fVar204 * 4.0 * auVar222._12_4_;
    auVar23._16_4_ = fVar205 * 4.0 * auVar222._16_4_;
    auVar23._20_4_ = fVar206 * 4.0 * auVar222._20_4_;
    auVar23._24_4_ = fVar207 * 4.0 * auVar222._24_4_;
    auVar23._28_4_ = 0x40800000;
    auVar137 = vsubps_avx(auVar22,auVar23);
    local_600 = vcmpps_avx(auVar137,auVar135,5);
    auVar245 = ZEXT3264(CONCAT428(0x80000000,
                                  CONCAT424(0x80000000,
                                            CONCAT420(0x80000000,
                                                      CONCAT416(0x80000000,
                                                                CONCAT412(0x80000000,
                                                                          CONCAT48(0x80000000,
                                                                                                                                                                      
                                                  0x8000000080000000)))))));
    local_320._0_4_ = fVar123 + fVar123;
    local_320._4_4_ = fVar124 + fVar124;
    local_320._8_4_ = fVar191 + fVar191;
    local_320._12_4_ = fVar204 + fVar204;
    local_320._16_4_ = fVar205 + fVar205;
    local_320._20_4_ = fVar206 + fVar206;
    local_320._24_4_ = fVar207 + fVar207;
    fVar92 = local_620._28_4_;
    local_320._28_4_ = fVar92 + fVar92;
    auVar224 = ZEXT1632(auVar9);
    if ((((((((local_600 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (local_600 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (local_600 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(local_600 >> 0x7f,0) == '\0') &&
          (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(local_600 >> 0xbf,0) == '\0') &&
        (local_600 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
        -1 < local_600[0x1f]) {
      auVar111._8_4_ = 0x7f800000;
      auVar111._0_8_ = 0x7f8000007f800000;
      auVar111._12_4_ = 0x7f800000;
      auVar111._16_4_ = 0x7f800000;
      auVar111._20_4_ = 0x7f800000;
      auVar111._24_4_ = 0x7f800000;
      auVar111._28_4_ = 0x7f800000;
      auVar264._8_4_ = 0xff800000;
      auVar264._0_8_ = 0xff800000ff800000;
      auVar264._12_4_ = 0xff800000;
      auVar264._16_4_ = 0xff800000;
      auVar264._20_4_ = 0xff800000;
      auVar264._24_4_ = 0xff800000;
      auVar264._28_4_ = 0xff800000;
    }
    else {
      auVar8 = vsqrtps_avx(auVar137);
      auVar135 = vcmpps_avx(auVar137,auVar135,5);
      auVar137 = vrcpps_avx(local_320);
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar238._16_4_ = 0x3f800000;
      auVar238._20_4_ = 0x3f800000;
      auVar238._24_4_ = 0x3f800000;
      auVar238._28_4_ = 0x3f800000;
      auVar9 = vfnmadd213ps_fma(auVar137,local_320,auVar238);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar137,auVar137);
      auVar213._0_8_ = local_300._0_8_ ^ 0x8000000080000000;
      auVar213._8_4_ = -local_300._8_4_;
      auVar213._12_4_ = -local_300._12_4_;
      auVar213._16_4_ = -local_300._16_4_;
      auVar213._20_4_ = -local_300._20_4_;
      auVar213._24_4_ = -local_300._24_4_;
      auVar213._28_4_ = -local_300._28_4_;
      auVar137 = vsubps_avx(auVar213,auVar8);
      auVar24._4_4_ = auVar9._4_4_ * auVar137._4_4_;
      auVar24._0_4_ = auVar9._0_4_ * auVar137._0_4_;
      auVar24._8_4_ = auVar9._8_4_ * auVar137._8_4_;
      auVar24._12_4_ = auVar9._12_4_ * auVar137._12_4_;
      auVar24._16_4_ = auVar137._16_4_ * 0.0;
      auVar24._20_4_ = auVar137._20_4_ * 0.0;
      auVar24._24_4_ = auVar137._24_4_ * 0.0;
      auVar24._28_4_ = local_300._28_4_;
      auVar137 = vsubps_avx(auVar8,local_300);
      auVar265._0_4_ = auVar9._0_4_ * auVar137._0_4_;
      auVar265._4_4_ = auVar9._4_4_ * auVar137._4_4_;
      auVar265._8_4_ = auVar9._8_4_ * auVar137._8_4_;
      auVar265._12_4_ = auVar9._12_4_ * auVar137._12_4_;
      auVar265._16_4_ = auVar137._16_4_ * 0.0;
      auVar265._20_4_ = auVar137._20_4_ * 0.0;
      auVar265._24_4_ = auVar137._24_4_ * 0.0;
      auVar265._28_4_ = 0;
      auVar9 = vfmadd213ps_fma(auVar224,auVar24,auVar261);
      local_3e0 = fVar121 * auVar9._0_4_;
      fStack_3dc = fVar122 * auVar9._4_4_;
      fStack_3d8 = fVar126 * auVar9._8_4_;
      fStack_3d4 = fVar125 * auVar9._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      fStack_3c4 = fVar92;
      auVar137 = vandps_avx(local_2e0,local_6a0);
      auVar137 = vmaxps_avx(local_480,auVar137);
      auVar25._4_4_ = auVar137._4_4_ * 1.9073486e-06;
      auVar25._0_4_ = auVar137._0_4_ * 1.9073486e-06;
      auVar25._8_4_ = auVar137._8_4_ * 1.9073486e-06;
      auVar25._12_4_ = auVar137._12_4_ * 1.9073486e-06;
      auVar25._16_4_ = auVar137._16_4_ * 1.9073486e-06;
      auVar25._20_4_ = auVar137._20_4_ * 1.9073486e-06;
      auVar25._24_4_ = auVar137._24_4_ * 1.9073486e-06;
      auVar25._28_4_ = auVar137._28_4_;
      auVar137 = vandps_avx(local_620,local_6a0);
      auVar137 = vcmpps_avx(auVar137,auVar25,1);
      auVar9 = vfmadd213ps_fma(auVar224,auVar265,auVar261);
      auVar112._8_4_ = 0x7f800000;
      auVar112._0_8_ = 0x7f8000007f800000;
      auVar112._12_4_ = 0x7f800000;
      auVar112._16_4_ = 0x7f800000;
      auVar112._20_4_ = 0x7f800000;
      auVar112._24_4_ = 0x7f800000;
      auVar112._28_4_ = 0x7f800000;
      auVar111 = vblendvps_avx(auVar112,auVar24,auVar135);
      local_400 = auVar9._0_4_ * fVar121;
      fStack_3fc = auVar9._4_4_ * fVar122;
      fStack_3f8 = auVar9._8_4_ * fVar126;
      fStack_3f4 = auVar9._12_4_ * fVar125;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      fStack_3e4 = fVar92;
      auVar239._8_4_ = 0xff800000;
      auVar239._0_8_ = 0xff800000ff800000;
      auVar239._12_4_ = 0xff800000;
      auVar239._16_4_ = 0xff800000;
      auVar239._20_4_ = 0xff800000;
      auVar239._24_4_ = 0xff800000;
      auVar239._28_4_ = 0xff800000;
      auVar264 = vblendvps_avx(auVar239,auVar265,auVar135);
      auVar8 = auVar135 & auVar137;
      if ((((((((auVar8 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar8 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar8 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar8 >> 0x7f,0) != '\0') ||
            (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar8 >> 0xbf,0) != '\0') ||
          (auVar8 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar8[0x1f] < '\0')
      {
        auVar137 = vandps_avx(auVar135,auVar137);
        auVar8 = vcmpps_avx(auVar222,_DAT_01f7b000,2);
        auVar91._8_4_ = 0xff800000;
        auVar91._0_8_ = 0xff800000ff800000;
        auVar91._12_4_ = 0xff800000;
        auVar91._16_4_ = 0xff800000;
        auVar91._20_4_ = 0xff800000;
        auVar91._24_4_ = 0xff800000;
        auVar91._28_4_ = 0xff800000;
        auVar251._8_4_ = 0x7f800000;
        auVar251._0_8_ = 0x7f8000007f800000;
        auVar251._12_4_ = 0x7f800000;
        auVar251._16_4_ = 0x7f800000;
        auVar251._20_4_ = 0x7f800000;
        auVar251._24_4_ = 0x7f800000;
        auVar251._28_4_ = 0x7f800000;
        auVar222 = vblendvps_avx(auVar251,auVar91,auVar8);
        auVar9 = vpackssdw_avx(auVar137._0_16_,auVar137._16_16_);
        auVar10 = vpmovsxwd_avx2(auVar9);
        auVar111 = vblendvps_avx(auVar111,auVar222,auVar10);
        auVar222 = vblendvps_avx(auVar91,auVar251,auVar8);
        auVar245 = ZEXT3264(auVar222);
        auVar264 = vblendvps_avx(auVar264,auVar222,auVar10);
        auVar218._0_8_ = auVar137._0_8_ ^ 0xffffffffffffffff;
        auVar218._8_4_ = auVar137._8_4_ ^ 0xffffffff;
        auVar218._12_4_ = auVar137._12_4_ ^ 0xffffffff;
        auVar218._16_4_ = auVar137._16_4_ ^ 0xffffffff;
        auVar218._20_4_ = auVar137._20_4_ ^ 0xffffffff;
        auVar218._24_4_ = auVar137._24_4_ ^ 0xffffffff;
        auVar218._28_4_ = auVar137._28_4_ ^ 0xffffffff;
        auVar222 = vorps_avx(auVar8,auVar218);
        local_600 = vandps_avx(auVar135,auVar222);
      }
    }
    auVar222 = local_340 & local_600;
    auVar243 = ZEXT3264(local_540);
    if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar222 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar222 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar222 >> 0x7f,0) == '\0') &&
          (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar222 >> 0xbf,0) == '\0') &&
        (auVar222 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar222[0x1f])
    {
      auVar229 = ZEXT3264(local_8e0);
      auVar252 = ZEXT3264(local_900);
      auVar262 = ZEXT3264(local_860);
      auVar268 = ZEXT3264(local_a40);
    }
    else {
      fVar92 = (ray->org).field_0.m128[3] - (float)local_7d0._0_4_;
      auVar83._4_4_ = fVar92;
      auVar83._0_4_ = fVar92;
      auVar83._8_4_ = fVar92;
      auVar83._12_4_ = fVar92;
      auVar83._16_4_ = fVar92;
      auVar83._20_4_ = fVar92;
      auVar83._24_4_ = fVar92;
      auVar83._28_4_ = fVar92;
      auVar137 = vmaxps_avx(auVar83,auVar111);
      fVar92 = ray->tfar - (float)local_7d0._0_4_;
      auVar113._4_4_ = fVar92;
      auVar113._0_4_ = fVar92;
      auVar113._8_4_ = fVar92;
      auVar113._12_4_ = fVar92;
      auVar113._16_4_ = fVar92;
      auVar113._20_4_ = fVar92;
      auVar113._24_4_ = fVar92;
      auVar113._28_4_ = fVar92;
      auVar135 = vminps_avx(auVar113,auVar264);
      auVar26._4_4_ = local_a60._4_4_ * fVar146;
      auVar26._0_4_ = (float)local_a60._0_4_ * fVar145;
      auVar26._8_4_ = local_a60._8_4_ * fVar147;
      auVar26._12_4_ = local_a60._12_4_ * fVar148;
      auVar26._16_4_ = local_a60._16_4_ * fVar170;
      auVar26._20_4_ = local_a60._20_4_ * fVar171;
      auVar26._24_4_ = local_a60._24_4_ * fVar172;
      auVar26._28_4_ = fVar92;
      auVar9 = vfmadd213ps_fma(auVar115,local_9a0,auVar26);
      auVar179 = vfmadd213ps_fma(auVar167,local_6c0,ZEXT1632(auVar9));
      auVar27._4_4_ = local_a60._4_4_ * fStack_67c;
      auVar27._0_4_ = (float)local_a60._0_4_ * local_680;
      auVar27._8_4_ = local_a60._8_4_ * fStack_678;
      auVar27._12_4_ = local_a60._12_4_ * fStack_674;
      auVar27._16_4_ = local_a60._16_4_ * fStack_670;
      auVar27._20_4_ = local_a60._20_4_ * fStack_66c;
      auVar27._24_4_ = local_a60._24_4_ * fStack_668;
      auVar27._28_4_ = auVar109._28_4_;
      auVar9 = vfmadd231ps_fma(auVar27,local_540,local_9a0);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_560,local_6c0);
      auVar245 = ZEXT3264(local_6a0);
      auVar222 = vandps_avx(local_6a0,ZEXT1632(auVar74));
      auVar184._8_4_ = 0x219392ef;
      auVar184._0_8_ = 0x219392ef219392ef;
      auVar184._12_4_ = 0x219392ef;
      auVar184._16_4_ = 0x219392ef;
      auVar184._20_4_ = 0x219392ef;
      auVar184._24_4_ = 0x219392ef;
      auVar184._28_4_ = 0x219392ef;
      auVar109 = vcmpps_avx(auVar222,auVar184,1);
      auVar222 = vrcpps_avx(ZEXT1632(auVar74));
      auVar266._8_4_ = 0x3f800000;
      auVar266._0_8_ = 0x3f8000003f800000;
      auVar266._12_4_ = 0x3f800000;
      auVar266._16_4_ = 0x3f800000;
      auVar266._20_4_ = 0x3f800000;
      auVar266._24_4_ = 0x3f800000;
      auVar266._28_4_ = 0x3f800000;
      auVar167 = ZEXT1632(auVar74);
      auVar9 = vfnmadd213ps_fma(auVar222,auVar167,auVar266);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar222,auVar222);
      auVar240._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar240._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar240._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar240._16_4_ = 0x80000000;
      auVar240._20_4_ = 0x80000000;
      auVar240._24_4_ = 0x80000000;
      auVar240._28_4_ = 0x80000000;
      auVar28._4_4_ = auVar9._4_4_ * -auVar179._4_4_;
      auVar28._0_4_ = auVar9._0_4_ * -auVar179._0_4_;
      auVar28._8_4_ = auVar9._8_4_ * -auVar179._8_4_;
      auVar28._12_4_ = auVar9._12_4_ * -auVar179._12_4_;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      auVar222 = vcmpps_avx(auVar167,auVar240,1);
      auVar222 = vorps_avx(auVar109,auVar222);
      auVar248._8_4_ = 0xff800000;
      auVar248._0_8_ = 0xff800000ff800000;
      auVar248._12_4_ = 0xff800000;
      auVar248._16_4_ = 0xff800000;
      auVar248._20_4_ = 0xff800000;
      auVar248._24_4_ = 0xff800000;
      auVar248._28_4_ = 0xff800000;
      auVar222 = vblendvps_avx(auVar28,auVar248,auVar222);
      auVar115 = vmaxps_avx(auVar137,auVar222);
      auVar222 = vcmpps_avx(auVar167,auVar240,6);
      auVar222 = vorps_avx(auVar109,auVar222);
      auVar241._8_4_ = 0x7f800000;
      auVar241._0_8_ = 0x7f8000007f800000;
      auVar241._12_4_ = 0x7f800000;
      auVar241._16_4_ = 0x7f800000;
      auVar241._20_4_ = 0x7f800000;
      auVar241._24_4_ = 0x7f800000;
      auVar241._28_4_ = 0x7f800000;
      auVar222 = vblendvps_avx(auVar28,auVar241,auVar222);
      auVar167 = vminps_avx(auVar135,auVar222);
      fVar92 = -local_820._0_4_;
      fVar127 = -local_820._4_4_;
      fVar128 = -local_820._8_4_;
      fVar145 = -local_820._12_4_;
      fVar146 = -local_820._16_4_;
      fVar147 = -local_820._20_4_;
      fVar148 = -local_820._24_4_;
      auVar166._0_8_ = local_840._0_8_ ^ 0x8000000080000000;
      auVar166._8_4_ = -local_840._8_4_;
      auVar166._12_4_ = -local_840._12_4_;
      auVar166._16_4_ = -local_840._16_4_;
      auVar166._20_4_ = -local_840._20_4_;
      auVar166._24_4_ = -local_840._24_4_;
      auVar166._28_4_ = local_840._28_4_ ^ 0x80000000;
      auVar46 = ZEXT812(0);
      auVar243 = ZEXT1264(auVar46) << 0x20;
      auVar222 = vsubps_avx(ZEXT1232(auVar46) << 0x20,_local_800);
      auVar109 = vsubps_avx(ZEXT1232(auVar46) << 0x20,local_980);
      auVar29._4_4_ = auVar109._4_4_ * fVar127;
      auVar29._0_4_ = auVar109._0_4_ * fVar92;
      auVar29._8_4_ = auVar109._8_4_ * fVar128;
      auVar29._12_4_ = auVar109._12_4_ * fVar145;
      auVar29._16_4_ = auVar109._16_4_ * fVar146;
      auVar29._20_4_ = auVar109._20_4_ * fVar147;
      auVar29._24_4_ = auVar109._24_4_ * fVar148;
      auVar29._28_4_ = auVar109._28_4_;
      auVar9 = vfmadd231ps_fma(auVar29,auVar166,auVar222);
      auVar185._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
      auVar185._8_4_ = -local_a80._8_4_;
      auVar185._12_4_ = -local_a80._12_4_;
      auVar185._16_4_ = -local_a80._16_4_;
      auVar185._20_4_ = -local_a80._20_4_;
      auVar185._24_4_ = -local_a80._24_4_;
      auVar185._28_4_ = local_a80._28_4_ ^ 0x80000000;
      auVar222 = vsubps_avx(ZEXT1232(auVar46) << 0x20,auVar11);
      auVar179 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar185,auVar222);
      auVar30._4_4_ = fVar127 * fStack_67c;
      auVar30._0_4_ = fVar92 * local_680;
      auVar30._8_4_ = fVar128 * fStack_678;
      auVar30._12_4_ = fVar145 * fStack_674;
      auVar30._16_4_ = fVar146 * fStack_670;
      auVar30._20_4_ = fVar147 * fStack_66c;
      auVar30._24_4_ = fVar148 * fStack_668;
      auVar30._28_4_ = local_820._28_4_ ^ 0x80000000;
      auVar9 = vfmadd231ps_fma(auVar30,local_540,auVar166);
      auVar74 = vfmadd231ps_fma(ZEXT1632(auVar9),_local_560,auVar185);
      auVar222 = vandps_avx(local_6a0,ZEXT1632(auVar74));
      auVar137 = vrcpps_avx(ZEXT1632(auVar74));
      auVar214._8_4_ = 0x219392ef;
      auVar214._0_8_ = 0x219392ef219392ef;
      auVar214._12_4_ = 0x219392ef;
      auVar214._16_4_ = 0x219392ef;
      auVar214._20_4_ = 0x219392ef;
      auVar214._24_4_ = 0x219392ef;
      auVar214._28_4_ = 0x219392ef;
      auVar109 = vcmpps_avx(auVar222,auVar214,1);
      auVar235._8_4_ = 0x3f800000;
      auVar235._0_8_ = 0x3f8000003f800000;
      auVar235._12_4_ = 0x3f800000;
      auVar235._16_4_ = 0x3f800000;
      auVar235._20_4_ = 0x3f800000;
      auVar235._24_4_ = 0x3f800000;
      auVar235._28_4_ = 0x3f800000;
      auVar135 = ZEXT1632(auVar74);
      auVar9 = vfnmadd213ps_fma(auVar137,auVar135,auVar235);
      auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar137,auVar137);
      auVar186._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
      auVar186._8_4_ = auVar74._8_4_ ^ 0x80000000;
      auVar186._12_4_ = auVar74._12_4_ ^ 0x80000000;
      auVar186._16_4_ = 0x80000000;
      auVar186._20_4_ = 0x80000000;
      auVar186._24_4_ = 0x80000000;
      auVar186._28_4_ = 0x80000000;
      auVar31._4_4_ = auVar9._4_4_ * -auVar179._4_4_;
      auVar31._0_4_ = auVar9._0_4_ * -auVar179._0_4_;
      auVar31._8_4_ = auVar9._8_4_ * -auVar179._8_4_;
      auVar31._12_4_ = auVar9._12_4_ * -auVar179._12_4_;
      auVar31._16_4_ = 0x80000000;
      auVar31._20_4_ = 0x80000000;
      auVar31._24_4_ = 0x80000000;
      auVar31._28_4_ = 0x80000000;
      auVar222 = vcmpps_avx(auVar135,auVar186,1);
      auVar222 = vorps_avx(auVar109,auVar222);
      auVar222 = vblendvps_avx(auVar31,auVar248,auVar222);
      local_8a0 = vmaxps_avx(auVar115,auVar222);
      auVar222 = vcmpps_avx(auVar135,auVar186,6);
      auVar222 = vorps_avx(auVar109,auVar222);
      auVar136._8_4_ = 0x7f800000;
      auVar136._0_8_ = 0x7f8000007f800000;
      auVar136._12_4_ = 0x7f800000;
      auVar136._16_4_ = 0x7f800000;
      auVar136._20_4_ = 0x7f800000;
      auVar136._24_4_ = 0x7f800000;
      auVar136._28_4_ = 0x7f800000;
      auVar109 = vblendvps_avx(auVar31,auVar136,auVar222);
      auVar222 = vandps_avx(local_340,local_600);
      local_4e0 = vminps_avx(auVar167,auVar109);
      auVar109 = vcmpps_avx(local_8a0,local_4e0,2);
      auVar115 = auVar222 & auVar109;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') {
        auVar50._4_4_ = fStack_3dc;
        auVar50._0_4_ = local_3e0;
        auVar50._8_4_ = fStack_3d8;
        auVar50._12_4_ = fStack_3d4;
        auVar50._16_4_ = uStack_3d0;
        auVar50._20_4_ = uStack_3cc;
        auVar50._24_4_ = uStack_3c8;
        auVar50._28_4_ = fStack_3c4;
        auVar215._8_4_ = 0x3f800000;
        auVar215._0_8_ = 0x3f8000003f800000;
        auVar215._12_4_ = 0x3f800000;
        auVar215._16_4_ = 0x3f800000;
        auVar215._20_4_ = 0x3f800000;
        auVar215._24_4_ = 0x3f800000;
        auVar215._28_4_ = 0x3f800000;
        auVar115 = vminps_avx(auVar50,auVar215);
        auVar137 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar115 = vmaxps_avx(auVar115,ZEXT832(0) << 0x20);
        auVar49._4_4_ = fStack_3fc;
        auVar49._0_4_ = local_400;
        auVar49._8_4_ = fStack_3f8;
        auVar49._12_4_ = fStack_3f4;
        auVar49._16_4_ = uStack_3f0;
        auVar49._20_4_ = uStack_3ec;
        auVar49._24_4_ = uStack_3e8;
        auVar49._28_4_ = fStack_3e4;
        auVar167 = vminps_avx(auVar49,auVar215);
        auVar167 = vmaxps_avx(auVar167,ZEXT832(0) << 0x20);
        auVar32._4_4_ = (auVar115._4_4_ + 1.0) * 0.125;
        auVar32._0_4_ = (auVar115._0_4_ + 0.0) * 0.125;
        auVar32._8_4_ = (auVar115._8_4_ + 2.0) * 0.125;
        auVar32._12_4_ = (auVar115._12_4_ + 3.0) * 0.125;
        auVar32._16_4_ = (auVar115._16_4_ + 4.0) * 0.125;
        auVar32._20_4_ = (auVar115._20_4_ + 5.0) * 0.125;
        auVar32._24_4_ = (auVar115._24_4_ + 6.0) * 0.125;
        auVar32._28_4_ = auVar115._28_4_ + 7.0;
        auVar9 = vfmadd213ps_fma(auVar32,local_6e0,local_920);
        auVar33._4_4_ = (auVar167._4_4_ + 1.0) * 0.125;
        auVar33._0_4_ = (auVar167._0_4_ + 0.0) * 0.125;
        auVar33._8_4_ = (auVar167._8_4_ + 2.0) * 0.125;
        auVar33._12_4_ = (auVar167._12_4_ + 3.0) * 0.125;
        auVar33._16_4_ = (auVar167._16_4_ + 4.0) * 0.125;
        auVar33._20_4_ = (auVar167._20_4_ + 5.0) * 0.125;
        auVar33._24_4_ = (auVar167._24_4_ + 6.0) * 0.125;
        auVar33._28_4_ = auVar167._28_4_ + 7.0;
        auVar179 = vfmadd213ps_fma(auVar33,local_6e0,local_920);
        auVar115 = vminps_avx(local_700,local_720);
        auVar167 = vminps_avx(local_740,auVar12);
        auVar115 = vminps_avx(auVar115,auVar167);
        auVar115 = vsubps_avx(auVar115,auVar108);
        auVar108 = vandps_avx(auVar109,auVar222);
        local_1a0 = ZEXT1632(auVar9);
        local_1c0 = ZEXT1632(auVar179);
        auVar34._4_4_ = auVar115._4_4_ * 0.99999976;
        auVar34._0_4_ = auVar115._0_4_ * 0.99999976;
        auVar34._8_4_ = auVar115._8_4_ * 0.99999976;
        auVar34._12_4_ = auVar115._12_4_ * 0.99999976;
        auVar34._16_4_ = auVar115._16_4_ * 0.99999976;
        auVar34._20_4_ = auVar115._20_4_ * 0.99999976;
        auVar34._24_4_ = auVar115._24_4_ * 0.99999976;
        auVar34._28_4_ = 0x3f7ffffc;
        auVar222 = vmaxps_avx(ZEXT1232(auVar46) << 0x20,auVar34);
        auVar35._4_4_ = auVar222._4_4_ * auVar222._4_4_;
        auVar35._0_4_ = auVar222._0_4_ * auVar222._0_4_;
        auVar35._8_4_ = auVar222._8_4_ * auVar222._8_4_;
        auVar35._12_4_ = auVar222._12_4_ * auVar222._12_4_;
        auVar35._16_4_ = auVar222._16_4_ * auVar222._16_4_;
        auVar35._20_4_ = auVar222._20_4_ * auVar222._20_4_;
        auVar35._24_4_ = auVar222._24_4_ * auVar222._24_4_;
        auVar35._28_4_ = auVar222._28_4_;
        auVar109 = vsubps_avx(auVar187,auVar35);
        auVar36._4_4_ = auVar109._4_4_ * fVar124 * 4.0;
        auVar36._0_4_ = auVar109._0_4_ * fVar123 * 4.0;
        auVar36._8_4_ = auVar109._8_4_ * fVar191 * 4.0;
        auVar36._12_4_ = auVar109._12_4_ * fVar204 * 4.0;
        auVar36._16_4_ = auVar109._16_4_ * fVar205 * 4.0;
        auVar36._20_4_ = auVar109._20_4_ * fVar206 * 4.0;
        auVar36._24_4_ = auVar109._24_4_ * fVar207 * 4.0;
        auVar36._28_4_ = auVar222._28_4_;
        auVar222 = vsubps_avx(auVar22,auVar36);
        local_8c0 = vcmpps_avx(auVar222,ZEXT832(0) << 0x20,5);
        auVar245 = ZEXT3264(local_8c0);
        if ((((((((local_8c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8c0 >> 0x7f,0) == '\0') &&
              (local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8c0 >> 0xbf,0) == '\0') &&
            (local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8c0[0x1f]) {
          auVar187 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar114 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_b00 = ZEXT1228(ZEXT412(0)) << 0x20;
          auVar167 = SUB6432(ZEXT864(0),0) << 0x20;
          _local_b40 = SUB3228(ZEXT832(0),0) << 0x20;
          auVar216._8_4_ = 0x7f800000;
          auVar216._0_8_ = 0x7f8000007f800000;
          auVar216._12_4_ = 0x7f800000;
          auVar216._16_4_ = 0x7f800000;
          auVar216._20_4_ = 0x7f800000;
          auVar216._24_4_ = 0x7f800000;
          auVar216._28_4_ = 0x7f800000;
          auVar225._8_4_ = 0xff800000;
          auVar225._0_8_ = 0xff800000ff800000;
          auVar225._12_4_ = 0xff800000;
          auVar225._16_4_ = 0xff800000;
          auVar225._20_4_ = 0xff800000;
          auVar225._24_4_ = 0xff800000;
          auVar225._28_4_ = 0xff800000;
          local_8c0 = auVar11;
        }
        else {
          auVar115 = vrcpps_avx(local_320);
          auVar138._8_4_ = 0x3f800000;
          auVar138._0_8_ = 0x3f8000003f800000;
          auVar138._12_4_ = 0x3f800000;
          auVar138._16_4_ = 0x3f800000;
          auVar138._20_4_ = 0x3f800000;
          auVar138._24_4_ = 0x3f800000;
          auVar138._28_4_ = 0x3f800000;
          auVar9 = vfnmadd213ps_fma(local_320,auVar115,auVar138);
          auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar115,auVar115);
          auVar115 = vsqrtps_avx(auVar222);
          auVar139._0_8_ = CONCAT44(fVar209,fVar208) ^ 0x8000000080000000;
          auVar139._8_4_ = -local_300._8_4_;
          auVar139._12_4_ = -local_300._12_4_;
          auVar139._16_4_ = -local_300._16_4_;
          auVar139._20_4_ = -local_300._20_4_;
          auVar139._24_4_ = -local_300._24_4_;
          auVar139._28_4_ = -local_300._28_4_;
          auVar167 = vsubps_avx(auVar139,auVar115);
          auVar115 = vsubps_avx(auVar115,local_300);
          auVar201._0_4_ = auVar167._0_4_ * auVar9._0_4_;
          auVar201._4_4_ = auVar167._4_4_ * auVar9._4_4_;
          auVar201._8_4_ = auVar167._8_4_ * auVar9._8_4_;
          auVar201._12_4_ = auVar167._12_4_ * auVar9._12_4_;
          auVar201._16_4_ = auVar167._16_4_ * 0.0;
          auVar201._20_4_ = auVar167._20_4_ * 0.0;
          auVar201._24_4_ = auVar167._24_4_ * 0.0;
          auVar201._28_4_ = 0;
          fVar92 = auVar115._0_4_ * auVar9._0_4_;
          fVar123 = auVar115._4_4_ * auVar9._4_4_;
          auVar37._4_4_ = fVar123;
          auVar37._0_4_ = fVar92;
          fVar124 = auVar115._8_4_ * auVar9._8_4_;
          auVar37._8_4_ = fVar124;
          fVar191 = auVar115._12_4_ * auVar9._12_4_;
          auVar37._12_4_ = fVar191;
          fVar204 = auVar115._16_4_ * 0.0;
          auVar37._16_4_ = fVar204;
          fVar205 = auVar115._20_4_ * 0.0;
          auVar37._20_4_ = fVar205;
          fVar206 = auVar115._24_4_ * 0.0;
          auVar37._24_4_ = fVar206;
          auVar37._28_4_ = local_8a0._28_4_;
          auVar9 = vfmadd213ps_fma(auVar224,auVar201,auVar261);
          auVar179 = vfmadd213ps_fma(auVar224,auVar37,auVar261);
          auVar38._28_4_ = auVar167._28_4_;
          auVar38._0_28_ =
               ZEXT1628(CONCAT412(fVar125 * auVar9._12_4_,
                                  CONCAT48(fVar126 * auVar9._8_4_,
                                           CONCAT44(fVar122 * auVar9._4_4_,fVar121 * auVar9._0_4_)))
                       );
          auVar115 = ZEXT1632(CONCAT412(fVar125 * auVar179._12_4_,
                                        CONCAT48(fVar126 * auVar179._8_4_,
                                                 CONCAT44(fVar122 * auVar179._4_4_,
                                                          fVar121 * auVar179._0_4_))));
          auVar9 = vfmadd213ps_fma(local_2a0,auVar38,auVar182);
          auVar179 = vfmadd213ps_fma(local_2a0,auVar115,auVar182);
          auVar74 = vfmadd213ps_fma(local_2c0,auVar38,auVar263);
          auVar78 = vfmadd213ps_fma(local_2c0,auVar115,auVar263);
          auVar221 = vfmadd213ps_fma(auVar38,auVar114,auVar164);
          auVar70 = vfmadd213ps_fma(auVar114,auVar115,auVar164);
          auVar39._4_4_ = (float)local_560._4_4_ * auVar201._4_4_;
          auVar39._0_4_ = (float)local_560._0_4_ * auVar201._0_4_;
          auVar39._8_4_ = fStack_558 * auVar201._8_4_;
          auVar39._12_4_ = fStack_554 * auVar201._12_4_;
          auVar39._16_4_ = fStack_550 * auVar201._16_4_;
          auVar39._20_4_ = fStack_54c * auVar201._20_4_;
          auVar39._24_4_ = fStack_548 * auVar201._24_4_;
          auVar39._28_4_ = 0;
          auVar114 = vsubps_avx(auVar39,ZEXT1632(auVar9));
          auVar243 = ZEXT3264(local_540);
          auVar168._0_4_ = local_540._0_4_ * auVar201._0_4_;
          auVar168._4_4_ = local_540._4_4_ * auVar201._4_4_;
          auVar168._8_4_ = local_540._8_4_ * auVar201._8_4_;
          auVar168._12_4_ = local_540._12_4_ * auVar201._12_4_;
          auVar168._16_4_ = local_540._16_4_ * auVar201._16_4_;
          auVar168._20_4_ = local_540._20_4_ * auVar201._20_4_;
          auVar168._24_4_ = local_540._24_4_ * auVar201._24_4_;
          auVar168._28_4_ = 0;
          auVar167 = vsubps_avx(auVar168,ZEXT1632(auVar74));
          auVar188._0_4_ = local_680 * auVar201._0_4_;
          auVar188._4_4_ = fStack_67c * auVar201._4_4_;
          auVar188._8_4_ = fStack_678 * auVar201._8_4_;
          auVar188._12_4_ = fStack_674 * auVar201._12_4_;
          auVar188._16_4_ = fStack_670 * auVar201._16_4_;
          auVar188._20_4_ = fStack_66c * auVar201._20_4_;
          auVar188._24_4_ = fStack_668 * auVar201._24_4_;
          auVar188._28_4_ = 0;
          auVar115 = vsubps_avx(auVar188,ZEXT1632(auVar221));
          _local_b40 = auVar115._0_28_;
          auVar40._4_4_ = fVar123 * (float)local_560._4_4_;
          auVar40._0_4_ = fVar92 * (float)local_560._0_4_;
          auVar40._8_4_ = fVar124 * fStack_558;
          auVar40._12_4_ = fVar191 * fStack_554;
          auVar40._16_4_ = fVar204 * fStack_550;
          auVar40._20_4_ = fVar205 * fStack_54c;
          auVar40._24_4_ = fVar206 * fStack_548;
          auVar40._28_4_ = auVar115._28_4_;
          auVar137 = vsubps_avx(auVar40,ZEXT1632(auVar179));
          auVar41._4_4_ = local_540._4_4_ * fVar123;
          auVar41._0_4_ = local_540._0_4_ * fVar92;
          auVar41._8_4_ = local_540._8_4_ * fVar124;
          auVar41._12_4_ = local_540._12_4_ * fVar191;
          auVar41._16_4_ = local_540._16_4_ * fVar204;
          auVar41._20_4_ = local_540._20_4_ * fVar205;
          auVar41._24_4_ = local_540._24_4_ * fVar206;
          auVar41._28_4_ = 0;
          auVar187 = vsubps_avx(auVar41,ZEXT1632(auVar78));
          auVar42._4_4_ = fVar123 * fStack_67c;
          auVar42._0_4_ = fVar92 * local_680;
          auVar42._8_4_ = fVar124 * fStack_678;
          auVar42._12_4_ = fVar191 * fStack_674;
          auVar42._16_4_ = fVar204 * fStack_670;
          auVar42._20_4_ = fVar205 * fStack_66c;
          auVar42._24_4_ = fVar206 * fStack_668;
          auVar42._28_4_ = local_560._28_4_;
          auVar115 = vsubps_avx(auVar42,ZEXT1632(auVar70));
          _local_b00 = auVar115._0_28_;
          auVar115 = vcmpps_avx(auVar222,_DAT_01f7b000,5);
          auVar217._8_4_ = 0x7f800000;
          auVar217._0_8_ = 0x7f8000007f800000;
          auVar217._12_4_ = 0x7f800000;
          auVar217._16_4_ = 0x7f800000;
          auVar217._20_4_ = 0x7f800000;
          auVar217._24_4_ = 0x7f800000;
          auVar217._28_4_ = 0x7f800000;
          auVar216 = vblendvps_avx(auVar217,auVar201,auVar115);
          auVar222 = vandps_avx(local_6a0,local_2e0);
          auVar222 = vmaxps_avx(local_480,auVar222);
          auVar43._4_4_ = auVar222._4_4_ * 1.9073486e-06;
          auVar43._0_4_ = auVar222._0_4_ * 1.9073486e-06;
          auVar43._8_4_ = auVar222._8_4_ * 1.9073486e-06;
          auVar43._12_4_ = auVar222._12_4_ * 1.9073486e-06;
          auVar43._16_4_ = auVar222._16_4_ * 1.9073486e-06;
          auVar43._20_4_ = auVar222._20_4_ * 1.9073486e-06;
          auVar43._24_4_ = auVar222._24_4_ * 1.9073486e-06;
          auVar43._28_4_ = auVar222._28_4_;
          auVar222 = vandps_avx(local_6a0,local_620);
          auVar222 = vcmpps_avx(auVar222,auVar43,1);
          auVar226._8_4_ = 0xff800000;
          auVar226._0_8_ = 0xff800000ff800000;
          auVar226._12_4_ = 0xff800000;
          auVar226._16_4_ = 0xff800000;
          auVar226._20_4_ = 0xff800000;
          auVar226._24_4_ = 0xff800000;
          auVar226._28_4_ = 0xff800000;
          auVar225 = vblendvps_avx(auVar226,auVar37,auVar115);
          auVar11 = auVar115 & auVar222;
          if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar11 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar11 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar11 >> 0x7f,0) == '\0') &&
                (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar11 >> 0xbf,0) == '\0') &&
              (auVar11 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar11[0x1f]) {
            auVar245 = ZEXT3264(local_8c0);
          }
          else {
            auVar222 = vandps_avx(auVar115,auVar222);
            auVar11 = vcmpps_avx(auVar109,_DAT_01f7b000,2);
            auVar242._8_4_ = 0xff800000;
            auVar242._0_8_ = 0xff800000ff800000;
            auVar242._12_4_ = 0xff800000;
            auVar242._16_4_ = 0xff800000;
            auVar242._20_4_ = 0xff800000;
            auVar242._24_4_ = 0xff800000;
            auVar242._28_4_ = 0xff800000;
            auVar243 = ZEXT3264(auVar242);
            auVar267._8_4_ = 0x7f800000;
            auVar267._0_8_ = 0x7f8000007f800000;
            auVar267._12_4_ = 0x7f800000;
            auVar267._16_4_ = 0x7f800000;
            auVar267._20_4_ = 0x7f800000;
            auVar267._24_4_ = 0x7f800000;
            auVar267._28_4_ = 0x7f800000;
            auVar109 = vblendvps_avx(auVar267,auVar242,auVar11);
            auVar9 = vpackssdw_avx(auVar222._0_16_,auVar222._16_16_);
            auVar12 = vpmovsxwd_avx2(auVar9);
            auVar216 = vblendvps_avx(auVar216,auVar109,auVar12);
            auVar109 = vblendvps_avx(auVar242,auVar267,auVar11);
            auVar225 = vblendvps_avx(auVar225,auVar109,auVar12);
            auVar203._0_8_ = auVar222._0_8_ ^ 0xffffffffffffffff;
            auVar203._8_4_ = auVar222._8_4_ ^ 0xffffffff;
            auVar203._12_4_ = auVar222._12_4_ ^ 0xffffffff;
            auVar203._16_4_ = auVar222._16_4_ ^ 0xffffffff;
            auVar203._20_4_ = auVar222._20_4_ ^ 0xffffffff;
            auVar203._24_4_ = auVar222._24_4_ ^ 0xffffffff;
            auVar203._28_4_ = auVar222._28_4_ ^ 0xffffffff;
            auVar222 = vorps_avx(auVar11,auVar203);
            auVar222 = vandps_avx(auVar115,auVar222);
            auVar245 = ZEXT3264(auVar222);
          }
        }
        uVar65 = *(undefined4 *)&(ray->dir).field_0;
        auVar202._4_4_ = uVar65;
        auVar202._0_4_ = uVar65;
        auVar202._8_4_ = uVar65;
        auVar202._12_4_ = uVar65;
        auVar202._16_4_ = uVar65;
        auVar202._20_4_ = uVar65;
        auVar202._24_4_ = uVar65;
        auVar202._28_4_ = uVar65;
        uVar65 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar249._4_4_ = uVar65;
        auVar249._0_4_ = uVar65;
        auVar249._8_4_ = uVar65;
        auVar249._12_4_ = uVar65;
        auVar249._16_4_ = uVar65;
        auVar249._20_4_ = uVar65;
        auVar249._24_4_ = uVar65;
        auVar249._28_4_ = uVar65;
        fVar92 = (ray->dir).field_0.m128[2];
        local_4c0 = local_8a0;
        local_4a0 = vminps_avx(local_4e0,auVar216);
        _local_760 = vmaxps_avx(local_8a0,auVar225);
        _local_500 = _local_760;
        auVar222 = vcmpps_avx(local_8a0,local_4a0,2);
        local_580 = vandps_avx(auVar108,auVar222);
        auVar222 = vcmpps_avx(_local_760,local_4e0,2);
        local_7a0 = vandps_avx(auVar108,auVar222);
        auVar227 = ZEXT3264(local_7a0);
        auVar108 = vorps_avx(local_7a0,local_580);
        auVar229 = ZEXT3264(local_a40);
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar108 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar108 >> 0x7f,0) != '\0') ||
              (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar108 >> 0xbf,0) != '\0') ||
            (auVar108 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar108[0x1f] < '\0') {
          auVar44._4_4_ = fVar92 * (float)local_b00._4_4_;
          auVar44._0_4_ = fVar92 * (float)local_b00._0_4_;
          auVar44._8_4_ = fVar92 * fStack_af8;
          auVar44._12_4_ = fVar92 * fStack_af4;
          auVar44._16_4_ = fVar92 * fStack_af0;
          auVar44._20_4_ = fVar92 * fStack_aec;
          auVar44._24_4_ = fVar92 * fStack_ae8;
          auVar44._28_4_ = auVar108._28_4_;
          auVar9 = vfmadd213ps_fma(auVar187,auVar249,auVar44);
          auVar45._4_4_ = fVar92 * (float)local_b40._4_4_;
          auVar45._0_4_ = fVar92 * (float)local_b40._0_4_;
          auVar45._8_4_ = fVar92 * fStack_b38;
          auVar45._12_4_ = fVar92 * fStack_b34;
          auVar45._16_4_ = fVar92 * fStack_b30;
          auVar45._20_4_ = fVar92 * fStack_b2c;
          auVar45._24_4_ = fVar92 * fStack_b28;
          auVar45._28_4_ = auVar108._28_4_;
          auVar179 = vfmadd213ps_fma(auVar167,auVar249,auVar45);
          auVar9 = vfmadd213ps_fma(auVar137,auVar202,ZEXT1632(auVar9));
          auVar86._0_8_ = auVar245._0_8_ ^ 0xffffffffffffffff;
          auVar86._8_4_ = auVar245._8_4_ ^ 0xffffffff;
          auVar86._12_4_ = auVar245._12_4_ ^ 0xffffffff;
          auVar86._16_4_ = auVar245._16_4_ ^ 0xffffffff;
          auVar86._20_4_ = auVar245._20_4_ ^ 0xffffffff;
          auVar86._24_4_ = auVar245._24_4_ ^ 0xffffffff;
          auVar86._28_4_ = auVar245._28_4_ ^ 0xffffffff;
          auVar227 = ZEXT3264(local_580);
          auVar108 = vandps_avx(ZEXT1632(auVar9),local_6a0);
          auVar189._8_4_ = 0x3e99999a;
          auVar189._0_8_ = 0x3e99999a3e99999a;
          auVar189._12_4_ = 0x3e99999a;
          auVar189._16_4_ = 0x3e99999a;
          auVar189._20_4_ = 0x3e99999a;
          auVar189._24_4_ = 0x3e99999a;
          auVar189._28_4_ = 0x3e99999a;
          auVar108 = vcmpps_avx(auVar108,auVar189,1);
          local_5c0 = vorps_avx(auVar108,auVar86);
          auVar9 = vfmadd213ps_fma(auVar114,auVar202,ZEXT1632(auVar179));
          auVar108 = vandps_avx(ZEXT1632(auVar9),local_6a0);
          auVar108 = vcmpps_avx(auVar108,auVar189,1);
          auVar108 = vorps_avx(auVar108,auVar86);
          auVar118._8_4_ = 3;
          auVar118._0_8_ = 0x300000003;
          auVar118._12_4_ = 3;
          auVar118._16_4_ = 3;
          auVar118._20_4_ = 3;
          auVar118._24_4_ = 3;
          auVar118._28_4_ = 3;
          auVar141._8_4_ = 2;
          auVar141._0_8_ = 0x200000002;
          auVar141._12_4_ = 2;
          auVar141._16_4_ = 2;
          auVar141._20_4_ = 2;
          auVar141._24_4_ = 2;
          auVar141._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar141,auVar118,auVar108);
          local_5e0._4_4_ = local_b4c;
          local_5e0._0_4_ = local_b4c;
          local_5e0._8_4_ = local_b4c;
          local_5e0._12_4_ = local_b4c;
          local_5e0._16_4_ = local_b4c;
          local_5e0._20_4_ = local_b4c;
          local_5e0._24_4_ = local_b4c;
          local_5e0._28_4_ = local_b4c;
          local_5a0 = vpcmpgtd_avx2(auVar108,local_5e0);
          auVar108 = vpandn_avx2(local_5a0,local_580);
          local_780._4_4_ = local_8a0._4_4_ + (float)local_660._4_4_;
          local_780._0_4_ = local_8a0._0_4_ + (float)local_660._0_4_;
          fStack_778 = local_8a0._8_4_ + fStack_658;
          fStack_774 = local_8a0._12_4_ + fStack_654;
          fStack_770 = local_8a0._16_4_ + fStack_650;
          fStack_76c = local_8a0._20_4_ + fStack_64c;
          fStack_768 = local_8a0._24_4_ + fStack_648;
          fStack_764 = local_8a0._28_4_ + fStack_644;
          while( true ) {
            local_420 = auVar108;
            if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar108 >> 0x7f,0) == '\0') &&
                  (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar108 >> 0xbf,0) == '\0') &&
                (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar108[0x1f]) break;
            auVar119._8_4_ = 0x7f800000;
            auVar119._0_8_ = 0x7f8000007f800000;
            auVar119._12_4_ = 0x7f800000;
            auVar119._16_4_ = 0x7f800000;
            auVar119._20_4_ = 0x7f800000;
            auVar119._24_4_ = 0x7f800000;
            auVar119._28_4_ = 0x7f800000;
            auVar222 = vblendvps_avx(auVar119,local_8a0,auVar108);
            auVar109 = vshufps_avx(auVar222,auVar222,0xb1);
            auVar109 = vminps_avx(auVar222,auVar109);
            auVar115 = vshufpd_avx(auVar109,auVar109,5);
            auVar109 = vminps_avx(auVar109,auVar115);
            auVar115 = vpermpd_avx2(auVar109,0x4e);
            auVar109 = vminps_avx(auVar109,auVar115);
            auVar222 = vcmpps_avx(auVar222,auVar109,0);
            auVar109 = auVar108 & auVar222;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0x7f,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0xbf,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar109[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar222,auVar108);
            }
            uVar56 = vmovmskps_avx(auVar108);
            iVar13 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar59 = (ulong)(uint)(iVar13 << 2);
            *(undefined4 *)(local_420 + uVar59) = 0;
            aVar2 = (ray->dir).field_0;
            local_880._0_16_ = (undefined1  [16])aVar2;
            auVar9 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar56 = *(uint *)(local_1a0 + uVar59);
            uVar61 = *(uint *)(local_4c0 + uVar59);
            if (auVar9._0_4_ < 0.0) {
              auVar245 = ZEXT1664(auVar245._0_16_);
              fVar92 = sqrtf(auVar9._0_4_);
              auVar229 = ZEXT3264(local_a40);
              uVar59 = extraout_RAX;
            }
            else {
              auVar9 = vsqrtss_avx(auVar9,auVar9);
              fVar92 = auVar9._0_4_;
            }
            auVar227 = ZEXT464(uVar56);
            auVar179 = vminps_avx(local_9e0,local_a00);
            auVar9 = vmaxps_avx(local_9e0,local_a00);
            auVar74 = vminps_avx(local_9f0,_local_a10);
            auVar78 = vminps_avx(auVar179,auVar74);
            auVar179 = vmaxps_avx(local_9f0,_local_a10);
            auVar74 = vmaxps_avx(auVar9,auVar179);
            auVar9 = vandps_avx(auVar78,local_a20);
            auVar179 = vandps_avx(auVar74,local_a20);
            auVar9 = vmaxps_avx(auVar9,auVar179);
            auVar179 = vmovshdup_avx(auVar9);
            auVar179 = vmaxss_avx(auVar179,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar179);
            local_8c0._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_820._0_4_ = fVar92 * 1.9073486e-06;
            local_740._0_16_ = vshufps_avx(auVar74,auVar74,0xff);
            auVar9 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar56),0x10);
            uVar62 = 0;
            while( true ) {
              bVar55 = (byte)uVar59;
              if (uVar62 == 5) break;
              local_980._0_16_ = vmovshdup_avx(auVar9);
              fVar126 = 1.0 - local_980._0_4_;
              auVar179 = vshufps_avx(auVar9,auVar9,0x55);
              fVar92 = auVar179._0_4_;
              auVar96._0_4_ = local_a00._0_4_ * fVar92;
              fVar121 = auVar179._4_4_;
              auVar96._4_4_ = local_a00._4_4_ * fVar121;
              fVar122 = auVar179._8_4_;
              auVar96._8_4_ = local_a00._8_4_ * fVar122;
              fVar123 = auVar179._12_4_;
              auVar96._12_4_ = local_a00._12_4_ * fVar123;
              auVar129._4_4_ = fVar126;
              auVar129._0_4_ = fVar126;
              auVar129._8_4_ = fVar126;
              auVar129._12_4_ = fVar126;
              auVar179 = vfmadd231ps_fma(auVar96,auVar129,local_9e0);
              auVar150._0_4_ = local_9f0._0_4_ * fVar92;
              auVar150._4_4_ = local_9f0._4_4_ * fVar121;
              auVar150._8_4_ = local_9f0._8_4_ * fVar122;
              auVar150._12_4_ = local_9f0._12_4_ * fVar123;
              auVar74 = vfmadd231ps_fma(auVar150,auVar129,local_a00);
              auVar197._0_4_ = fVar92 * auVar74._0_4_;
              auVar197._4_4_ = fVar121 * auVar74._4_4_;
              auVar197._8_4_ = fVar122 * auVar74._8_4_;
              auVar197._12_4_ = fVar123 * auVar74._12_4_;
              auVar78 = vfmadd231ps_fma(auVar197,auVar129,auVar179);
              auVar97._0_4_ = fVar92 * (float)local_a10._0_4_;
              auVar97._4_4_ = fVar121 * (float)local_a10._4_4_;
              auVar97._8_4_ = fVar122 * fStack_a08;
              auVar97._12_4_ = fVar123 * fStack_a04;
              auVar179 = vfmadd231ps_fma(auVar97,auVar129,local_9f0);
              auVar175._0_4_ = fVar92 * auVar179._0_4_;
              auVar175._4_4_ = fVar121 * auVar179._4_4_;
              auVar175._8_4_ = fVar122 * auVar179._8_4_;
              auVar175._12_4_ = fVar123 * auVar179._12_4_;
              local_a80._0_16_ = vfmadd231ps_fma(auVar175,auVar129,auVar74);
              fVar124 = auVar9._0_4_;
              auVar98._4_4_ = fVar124;
              auVar98._0_4_ = fVar124;
              auVar98._8_4_ = fVar124;
              auVar98._12_4_ = fVar124;
              auVar179 = vfmadd213ps_fma(auVar98,local_880._0_16_,_DAT_01f45a50);
              auVar73._0_4_ = fVar92 * local_a80._0_4_;
              auVar73._4_4_ = fVar121 * local_a80._4_4_;
              auVar73._8_4_ = fVar122 * local_a80._8_4_;
              auVar73._12_4_ = fVar123 * local_a80._12_4_;
              auVar74 = vfmadd231ps_fma(auVar73,auVar78,auVar129);
              local_6c0._0_16_ = auVar74;
              auVar179 = vsubps_avx(auVar179,auVar74);
              _local_800 = auVar179;
              auVar179 = vdpps_avx(auVar179,auVar179,0x7f);
              fVar92 = auVar179._0_4_;
              if (fVar92 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar126);
                local_a60._0_16_ = auVar78;
                auVar252._0_4_ = sqrtf(fVar92);
                auVar252._4_60_ = extraout_var;
                auVar74 = auVar252._0_16_;
                uVar59 = extraout_RAX_00;
                auVar78 = local_a60._0_16_;
                auVar221 = local_9a0._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar179,auVar179);
                auVar221 = ZEXT416((uint)fVar126);
              }
              auVar78 = vsubps_avx(local_a80._0_16_,auVar78);
              auVar211._0_4_ = auVar78._0_4_ * 3.0;
              auVar211._4_4_ = auVar78._4_4_ * 3.0;
              auVar211._8_4_ = auVar78._8_4_ * 3.0;
              auVar211._12_4_ = auVar78._12_4_ * 3.0;
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar221,local_980._0_16_);
              auVar70 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_980._0_16_,auVar221);
              fVar121 = auVar221._0_4_ * 6.0;
              fVar122 = auVar78._0_4_ * 6.0;
              fVar123 = auVar70._0_4_ * 6.0;
              fVar126 = local_980._0_4_ * 6.0;
              auVar151._0_4_ = fVar126 * (float)local_a10._0_4_;
              auVar151._4_4_ = fVar126 * (float)local_a10._4_4_;
              auVar151._8_4_ = fVar126 * fStack_a08;
              auVar151._12_4_ = fVar126 * fStack_a04;
              auVar99._4_4_ = fVar123;
              auVar99._0_4_ = fVar123;
              auVar99._8_4_ = fVar123;
              auVar99._12_4_ = fVar123;
              auVar78 = vfmadd132ps_fma(auVar99,auVar151,local_9f0);
              auVar152._4_4_ = fVar122;
              auVar152._0_4_ = fVar122;
              auVar152._8_4_ = fVar122;
              auVar152._12_4_ = fVar122;
              auVar78 = vfmadd132ps_fma(auVar152,auVar78,local_a00);
              auVar221 = vdpps_avx(auVar211,auVar211,0x7f);
              auVar100._4_4_ = fVar121;
              auVar100._0_4_ = fVar121;
              auVar100._8_4_ = fVar121;
              auVar100._12_4_ = fVar121;
              auVar69 = vfmadd132ps_fma(auVar100,auVar78,local_9e0);
              auVar78 = vblendps_avx(auVar221,_DAT_01f45a50,0xe);
              auVar70 = vrsqrtss_avx(auVar78,auVar78);
              fVar123 = auVar221._0_4_;
              fVar121 = auVar70._0_4_;
              auVar70 = vdpps_avx(auVar211,auVar69,0x7f);
              fVar121 = fVar121 * 1.5 + fVar123 * -0.5 * fVar121 * fVar121 * fVar121;
              auVar101._0_4_ = auVar69._0_4_ * fVar123;
              auVar101._4_4_ = auVar69._4_4_ * fVar123;
              auVar101._8_4_ = auVar69._8_4_ * fVar123;
              auVar101._12_4_ = auVar69._12_4_ * fVar123;
              fVar122 = auVar70._0_4_;
              auVar198._0_4_ = auVar211._0_4_ * fVar122;
              auVar198._4_4_ = auVar211._4_4_ * fVar122;
              auVar198._8_4_ = auVar211._8_4_ * fVar122;
              auVar198._12_4_ = auVar211._12_4_ * fVar122;
              auVar70 = vsubps_avx(auVar101,auVar198);
              auVar78 = vrcpss_avx(auVar78,auVar78);
              auVar69 = vfnmadd213ss_fma(auVar78,auVar221,ZEXT416(0x40000000));
              fVar122 = auVar78._0_4_ * auVar69._0_4_;
              auVar78 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                   ZEXT416((uint)(fVar124 * (float)local_820._0_4_)));
              auVar243 = ZEXT1664(auVar78);
              uVar47 = CONCAT44(auVar211._4_4_,auVar211._0_4_);
              local_a80._0_8_ = uVar47 ^ 0x8000000080000000;
              local_a80._8_4_ = -auVar211._8_4_;
              local_a80._12_4_ = -auVar211._12_4_;
              auVar153._0_4_ = fVar121 * auVar70._0_4_ * fVar122;
              auVar153._4_4_ = fVar121 * auVar70._4_4_ * fVar122;
              auVar153._8_4_ = fVar121 * auVar70._8_4_ * fVar122;
              auVar153._12_4_ = fVar121 * auVar70._12_4_ * fVar122;
              auVar233._0_4_ = auVar211._0_4_ * fVar121;
              auVar233._4_4_ = auVar211._4_4_ * fVar121;
              auVar233._8_4_ = auVar211._8_4_ * fVar121;
              auVar233._12_4_ = auVar211._12_4_ * fVar121;
              local_980._0_16_ = auVar211;
              local_9a0._0_4_ = auVar78._0_4_;
              if (fVar123 < -fVar123) {
                local_a60._0_4_ = auVar74._0_4_;
                local_840._0_16_ = auVar233;
                local_920._0_16_ = auVar153;
                fVar121 = sqrtf(fVar123);
                auVar74 = ZEXT416((uint)local_a60._0_4_);
                auVar243 = ZEXT464((uint)local_9a0._0_4_);
                uVar59 = extraout_RAX_01;
                auVar153 = local_920._0_16_;
                auVar233 = local_840._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar221,auVar221);
                fVar121 = auVar78._0_4_;
              }
              auVar78 = vdpps_avx(_local_800,auVar233,0x7f);
              auVar130 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar74,auVar243._0_16_);
              auVar221 = vdpps_avx(local_a80._0_16_,auVar233,0x7f);
              auVar70 = vdpps_avx(_local_800,auVar153,0x7f);
              auVar69 = vdpps_avx(local_880._0_16_,auVar233,0x7f);
              auVar74 = vfmadd213ss_fma(ZEXT416((uint)(auVar74._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_8c0._0_4_ / fVar121)),auVar130);
              local_a60._0_4_ = auVar74._0_4_;
              auVar75._0_4_ = auVar78._0_4_ * auVar78._0_4_;
              auVar75._4_4_ = auVar78._4_4_ * auVar78._4_4_;
              auVar75._8_4_ = auVar78._8_4_ * auVar78._8_4_;
              auVar75._12_4_ = auVar78._12_4_ * auVar78._12_4_;
              auVar74 = vdpps_avx(_local_800,local_a80._0_16_,0x7f);
              auVar94 = vsubps_avx(auVar179,auVar75);
              auVar130 = vrsqrtss_avx(auVar94,auVar94);
              fVar122 = auVar94._0_4_;
              fVar121 = auVar130._0_4_;
              fVar121 = fVar121 * 1.5 + fVar122 * -0.5 * fVar121 * fVar121 * fVar121;
              auVar130 = vdpps_avx(_local_800,local_880._0_16_,0x7f);
              local_a80._0_16_ = ZEXT416((uint)(auVar221._0_4_ + auVar70._0_4_));
              auVar74 = vfnmadd231ss_fma(auVar74,auVar78,local_a80._0_16_);
              auVar221 = vfnmadd231ss_fma(auVar130,auVar78,auVar69);
              if (fVar122 < 0.0) {
                local_840._0_16_ = auVar78;
                local_920._0_16_ = auVar69;
                local_6e0._0_16_ = auVar74;
                local_700._0_4_ = fVar121;
                local_720._0_16_ = auVar221;
                fVar122 = sqrtf(fVar122);
                auVar243 = ZEXT464((uint)local_9a0._0_4_);
                uVar59 = extraout_RAX_02;
                fVar121 = (float)local_700._0_4_;
                auVar221 = local_720._0_16_;
                auVar74 = local_6e0._0_16_;
                auVar69 = local_920._0_16_;
                auVar78 = local_840._0_16_;
              }
              else {
                auVar70 = vsqrtss_avx(auVar94,auVar94);
                fVar122 = auVar70._0_4_;
              }
              auVar245 = ZEXT1664(auVar179);
              auVar227 = ZEXT3264(auVar234);
              auVar70 = vpermilps_avx(local_6c0._0_16_,0xff);
              fVar122 = fVar122 - auVar70._0_4_;
              auVar70 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
              auVar74 = vfmsub213ss_fma(auVar74,ZEXT416((uint)fVar121),auVar70);
              auVar154._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
              auVar154._8_4_ = auVar69._8_4_ ^ 0x80000000;
              auVar154._12_4_ = auVar69._12_4_ ^ 0x80000000;
              auVar176._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
              auVar176._8_4_ = auVar74._8_4_ ^ 0x80000000;
              auVar176._12_4_ = auVar74._12_4_ ^ 0x80000000;
              auVar130 = ZEXT416((uint)(auVar221._0_4_ * fVar121));
              auVar221 = vfmsub231ss_fma(ZEXT416((uint)(auVar69._0_4_ * auVar74._0_4_)),
                                         local_a80._0_16_,auVar130);
              auVar74 = vinsertps_avx(auVar176,auVar130,0x1c);
              uVar65 = auVar221._0_4_;
              auVar177._4_4_ = uVar65;
              auVar177._0_4_ = uVar65;
              auVar177._8_4_ = uVar65;
              auVar177._12_4_ = uVar65;
              auVar74 = vdivps_avx(auVar74,auVar177);
              auVar221 = vinsertps_avx(local_a80._0_16_,auVar154,0x10);
              auVar221 = vdivps_avx(auVar221,auVar177);
              fVar121 = auVar78._0_4_;
              auVar131._0_4_ = fVar121 * auVar74._0_4_ + fVar122 * auVar221._0_4_;
              auVar131._4_4_ = fVar121 * auVar74._4_4_ + fVar122 * auVar221._4_4_;
              auVar131._8_4_ = fVar121 * auVar74._8_4_ + fVar122 * auVar221._8_4_;
              auVar131._12_4_ = fVar121 * auVar74._12_4_ + fVar122 * auVar221._12_4_;
              auVar9 = vsubps_avx(auVar9,auVar131);
              auVar74 = vandps_avx(auVar78,local_a20);
              if (auVar74._0_4_ < (float)local_a60._0_4_) {
                auVar78 = vfmadd231ss_fma(ZEXT416((uint)(auVar243._0_4_ + (float)local_a60._0_4_)),
                                          local_740._0_16_,ZEXT416(0x36000000));
                auVar74 = vandps_avx(ZEXT416((uint)fVar122),local_a20);
                if (auVar74._0_4_ < auVar78._0_4_) {
                  bVar64 = uVar62 < 5;
                  fVar121 = auVar9._0_4_ + (float)local_7d0._0_4_;
                  if ((ray->org).field_0.m128[3] <= fVar121) {
                    fVar122 = ray->tfar;
                    auVar229 = ZEXT3264(local_a40);
                    if (fVar121 <= fVar122) {
                      auVar9 = vmovshdup_avx(auVar9);
                      bVar55 = 0;
                      fVar123 = auVar9._0_4_;
                      if (0.0 <= fVar123) {
                        if (fVar123 <= 1.0) {
                          auVar9 = vrsqrtss_avx(auVar179,auVar179);
                          fVar126 = auVar9._0_4_;
                          pGVar5 = (context->scene->geometries).items[uVar60].ptr;
                          if ((pGVar5->mask & ray->mask) == 0) {
                            bVar55 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar55 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0))
                          {
                            fVar92 = fVar126 * 1.5 + fVar92 * -0.5 * fVar126 * fVar126 * fVar126;
                            auVar155._0_4_ = fVar92 * (float)local_800._0_4_;
                            auVar155._4_4_ = fVar92 * (float)local_800._4_4_;
                            auVar155._8_4_ = fVar92 * fStack_7f8;
                            auVar155._12_4_ = fVar92 * fStack_7f4;
                            auVar221 = vfmadd213ps_fma(auVar70,auVar155,local_980._0_16_);
                            auVar9 = vshufps_avx(auVar155,auVar155,0xc9);
                            auVar74 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                            auVar156._0_4_ = auVar155._0_4_ * auVar74._0_4_;
                            auVar156._4_4_ = auVar155._4_4_ * auVar74._4_4_;
                            auVar156._8_4_ = auVar155._8_4_ * auVar74._8_4_;
                            auVar156._12_4_ = auVar155._12_4_ * auVar74._12_4_;
                            auVar78 = vfmsub231ps_fma(auVar156,local_980._0_16_,auVar9);
                            auVar9 = vshufps_avx(auVar78,auVar78,0xc9);
                            auVar74 = vshufps_avx(auVar221,auVar221,0xc9);
                            auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                            auVar76._0_4_ = auVar221._0_4_ * auVar78._0_4_;
                            auVar76._4_4_ = auVar221._4_4_ * auVar78._4_4_;
                            auVar76._8_4_ = auVar221._8_4_ * auVar78._8_4_;
                            auVar76._12_4_ = auVar221._12_4_ * auVar78._12_4_;
                            auVar74 = vfmsub231ps_fma(auVar76,auVar9,auVar74);
                            auVar9 = vshufps_avx(auVar74,auVar74,0xe9);
                            local_950 = vmovlps_avx(auVar9);
                            local_948 = auVar74._0_4_;
                            local_940 = 0;
                            local_934 = context->user->instID[0];
                            local_930 = context->user->instPrimID[0];
                            ray->tfar = fVar121;
                            local_640._0_4_ = 0xffffffff;
                            local_9d0.valid = (int *)local_640;
                            local_9d0.geometryUserPtr = pGVar5->userPtr;
                            local_9d0.context = context->user;
                            local_9d0.hit = (RTCHitN *)&local_950;
                            local_9d0.N = 1;
                            local_9d0.ray = (RTCRayN *)ray;
                            local_944 = fVar123;
                            local_93c = uVar1;
                            local_938 = uVar60;
                            if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010eacfb:
                              p_Var6 = context->args->filter;
                              if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar227 = ZEXT1664(auVar227._0_16_);
                                auVar245 = ZEXT1664(auVar245._0_16_);
                                (*p_Var6)(&local_9d0);
                                if (*local_9d0.valid == 0) goto LAB_010ead7b;
                              }
                              bVar55 = 1;
                            }
                            else {
                              auVar227 = ZEXT1664(auVar232);
                              auVar245 = ZEXT1664(auVar179);
                              (*pGVar5->occlusionFilterN)(&local_9d0);
                              if (*local_9d0.valid != 0) goto LAB_010eacfb;
LAB_010ead7b:
                              ray->tfar = fVar122;
                              bVar55 = 0;
                            }
                            auVar229 = ZEXT3264(local_a40);
                          }
                        }
                        goto LAB_010ead4a;
                      }
                    }
                  }
                  bVar55 = 0;
                  auVar229 = ZEXT3264(local_a40);
                  goto LAB_010ead4a;
                }
              }
              uVar62 = uVar62 + 1;
              auVar229 = ZEXT3264(local_a40);
            }
            bVar64 = false;
LAB_010ead4a:
            fVar92 = ray->tfar;
            auVar87._4_4_ = fVar92;
            auVar87._0_4_ = fVar92;
            auVar87._8_4_ = fVar92;
            auVar87._12_4_ = fVar92;
            auVar87._16_4_ = fVar92;
            auVar87._20_4_ = fVar92;
            auVar87._24_4_ = fVar92;
            auVar87._28_4_ = fVar92;
            bVar63 = bVar63 | bVar64 & bVar55;
            auVar108 = vcmpps_avx(_local_780,auVar87,2);
            auVar108 = vandps_avx(auVar108,local_420);
          }
          auVar262 = ZEXT3264(auVar229._0_32_);
          auVar88._0_4_ = local_760._0_4_ + (float)local_660._0_4_;
          auVar88._4_4_ = local_760._4_4_ + (float)local_660._4_4_;
          auVar88._8_4_ = local_760._8_4_ + fStack_658;
          auVar88._12_4_ = local_760._12_4_ + fStack_654;
          auVar88._16_4_ = local_760._16_4_ + fStack_650;
          auVar88._20_4_ = local_760._20_4_ + fStack_64c;
          auVar88._24_4_ = local_760._24_4_ + fStack_648;
          auVar88._28_4_ = local_760._28_4_ + fStack_644;
          fVar121 = ray->tfar;
          fVar92 = ray->tfar;
          auVar142._4_4_ = fVar92;
          auVar142._0_4_ = fVar92;
          auVar142._8_4_ = fVar92;
          auVar142._12_4_ = fVar92;
          auVar142._16_4_ = fVar92;
          auVar142._20_4_ = fVar92;
          auVar142._24_4_ = fVar92;
          auVar142._28_4_ = fVar92;
          auVar108 = vcmpps_avx(auVar88,auVar142,2);
          _local_780 = vandps_avx(auVar108,local_7a0);
          auVar89._8_4_ = 3;
          auVar89._0_8_ = 0x300000003;
          auVar89._12_4_ = 3;
          auVar89._16_4_ = 3;
          auVar89._20_4_ = 3;
          auVar89._24_4_ = 3;
          auVar89._28_4_ = 3;
          auVar143._8_4_ = 2;
          auVar143._0_8_ = 0x200000002;
          auVar143._12_4_ = 2;
          auVar143._16_4_ = 2;
          auVar143._20_4_ = 2;
          auVar143._24_4_ = 2;
          auVar143._28_4_ = 2;
          auVar108 = vblendvps_avx(auVar143,auVar89,local_5c0);
          local_7a0 = vpcmpgtd_avx2(auVar108,local_5e0);
          local_640 = vpandn_avx2(local_7a0,_local_780);
          local_8a0 = _local_500;
          local_760._4_4_ = (float)local_660._4_4_ + (float)local_500._4_4_;
          local_760._0_4_ = (float)local_660._0_4_ + (float)local_500._0_4_;
          fStack_758 = fStack_658 + fStack_4f8;
          fStack_754 = fStack_654 + fStack_4f4;
          fStack_750 = fStack_650 + fStack_4f0;
          fStack_74c = fStack_64c + fStack_4ec;
          fStack_748 = fStack_648 + fStack_4e8;
          fStack_744 = fStack_644 + fStack_4e4;
          auVar229 = ZEXT3264(local_8e0);
          auVar243 = ZEXT3264(local_900);
          for (; (((((((local_640 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                      (local_640 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (local_640 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    SUB321(local_640 >> 0x7f,0) != '\0') ||
                   (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  SUB321(local_640 >> 0xbf,0) != '\0') ||
                 (local_640 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 local_640[0x1f] < '\0'; local_640 = vandps_avx(auVar108,local_640)) {
            auVar120._8_4_ = 0x7f800000;
            auVar120._0_8_ = 0x7f8000007f800000;
            auVar120._12_4_ = 0x7f800000;
            auVar120._16_4_ = 0x7f800000;
            auVar120._20_4_ = 0x7f800000;
            auVar120._24_4_ = 0x7f800000;
            auVar120._28_4_ = 0x7f800000;
            auVar108 = vblendvps_avx(auVar120,local_8a0,local_640);
            auVar222 = vshufps_avx(auVar108,auVar108,0xb1);
            auVar222 = vminps_avx(auVar108,auVar222);
            auVar109 = vshufpd_avx(auVar222,auVar222,5);
            auVar222 = vminps_avx(auVar222,auVar109);
            auVar109 = vpermpd_avx2(auVar222,0x4e);
            auVar222 = vminps_avx(auVar222,auVar109);
            auVar222 = vcmpps_avx(auVar108,auVar222,0);
            auVar109 = local_640 & auVar222;
            auVar108 = local_640;
            if ((((((((auVar109 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar109 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar109 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar109 >> 0x7f,0) != '\0') ||
                  (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar109 >> 0xbf,0) != '\0') ||
                (auVar109 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar109[0x1f] < '\0') {
              auVar108 = vandps_avx(auVar222,local_640);
            }
            uVar56 = vmovmskps_avx(auVar108);
            iVar13 = 0;
            for (; (uVar56 & 1) == 0; uVar56 = uVar56 >> 1 | 0x80000000) {
              iVar13 = iVar13 + 1;
            }
            uVar59 = (ulong)(uint)(iVar13 << 2);
            *(undefined4 *)(local_640 + uVar59) = 0;
            aVar2 = (ray->dir).field_0;
            local_880._0_16_ = (undefined1  [16])aVar2;
            auVar9 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
            uVar56 = *(uint *)(local_1c0 + uVar59);
            uVar61 = *(uint *)(local_4e0 + uVar59);
            if (auVar9._0_4_ < 0.0) {
              auVar245 = ZEXT1664(auVar245._0_16_);
              fVar92 = sqrtf(auVar9._0_4_);
              auVar262 = ZEXT3264(local_a40);
              auVar243 = ZEXT3264(local_900);
              auVar229 = ZEXT3264(local_8e0);
              uVar59 = extraout_RAX_03;
            }
            else {
              auVar9 = vsqrtss_avx(auVar9,auVar9);
              fVar92 = auVar9._0_4_;
            }
            auVar179 = vminps_avx(local_9e0,local_a00);
            auVar9 = vmaxps_avx(local_9e0,local_a00);
            auVar74 = vminps_avx(local_9f0,_local_a10);
            auVar78 = vminps_avx(auVar179,auVar74);
            auVar179 = vmaxps_avx(local_9f0,_local_a10);
            auVar74 = vmaxps_avx(auVar9,auVar179);
            auVar9 = vandps_avx(auVar78,local_a20);
            auVar179 = vandps_avx(auVar74,local_a20);
            auVar9 = vmaxps_avx(auVar9,auVar179);
            auVar179 = vmovshdup_avx(auVar9);
            auVar179 = vmaxss_avx(auVar179,auVar9);
            auVar9 = vshufpd_avx(auVar9,auVar9,1);
            auVar9 = vmaxss_avx(auVar9,auVar179);
            local_8c0._0_4_ = auVar9._0_4_ * 1.9073486e-06;
            local_840._0_4_ = fVar92 * 1.9073486e-06;
            local_740._0_16_ = vshufps_avx(auVar74,auVar74,0xff);
            auVar9 = vinsertps_avx(ZEXT416(uVar61),ZEXT416(uVar56),0x10);
            auVar227 = ZEXT1664(auVar9);
            uVar62 = 0;
            while( true ) {
              bVar55 = (byte)uVar59;
              if (uVar62 == 5) break;
              auVar221 = auVar227._0_16_;
              local_980._0_16_ = vmovshdup_avx(auVar221);
              fVar126 = 1.0 - local_980._0_4_;
              auVar9 = vshufps_avx(auVar221,auVar221,0x55);
              fVar92 = auVar9._0_4_;
              auVar102._0_4_ = local_a00._0_4_ * fVar92;
              fVar121 = auVar9._4_4_;
              auVar102._4_4_ = local_a00._4_4_ * fVar121;
              fVar122 = auVar9._8_4_;
              auVar102._8_4_ = local_a00._8_4_ * fVar122;
              fVar123 = auVar9._12_4_;
              auVar102._12_4_ = local_a00._12_4_ * fVar123;
              auVar132._4_4_ = fVar126;
              auVar132._0_4_ = fVar126;
              auVar132._8_4_ = fVar126;
              auVar132._12_4_ = fVar126;
              auVar9 = vfmadd231ps_fma(auVar102,auVar132,local_9e0);
              auVar157._0_4_ = local_9f0._0_4_ * fVar92;
              auVar157._4_4_ = local_9f0._4_4_ * fVar121;
              auVar157._8_4_ = local_9f0._8_4_ * fVar122;
              auVar157._12_4_ = local_9f0._12_4_ * fVar123;
              auVar179 = vfmadd231ps_fma(auVar157,auVar132,local_a00);
              auVar199._0_4_ = fVar92 * auVar179._0_4_;
              auVar199._4_4_ = fVar121 * auVar179._4_4_;
              auVar199._8_4_ = fVar122 * auVar179._8_4_;
              auVar199._12_4_ = fVar123 * auVar179._12_4_;
              auVar74 = vfmadd231ps_fma(auVar199,auVar132,auVar9);
              auVar103._0_4_ = fVar92 * (float)local_a10._0_4_;
              auVar103._4_4_ = fVar121 * (float)local_a10._4_4_;
              auVar103._8_4_ = fVar122 * fStack_a08;
              auVar103._12_4_ = fVar123 * fStack_a04;
              auVar9 = vfmadd231ps_fma(auVar103,auVar132,local_9f0);
              auVar178._0_4_ = fVar92 * auVar9._0_4_;
              auVar178._4_4_ = fVar121 * auVar9._4_4_;
              auVar178._8_4_ = fVar122 * auVar9._8_4_;
              auVar178._12_4_ = fVar123 * auVar9._12_4_;
              auVar179 = vfmadd231ps_fma(auVar178,auVar132,auVar179);
              uVar65 = auVar227._0_4_;
              auVar104._4_4_ = uVar65;
              auVar104._0_4_ = uVar65;
              auVar104._8_4_ = uVar65;
              auVar104._12_4_ = uVar65;
              auVar9 = vfmadd213ps_fma(auVar104,local_880._0_16_,_DAT_01f45a50);
              auVar77._0_4_ = fVar92 * auVar179._0_4_;
              auVar77._4_4_ = fVar121 * auVar179._4_4_;
              auVar77._8_4_ = fVar122 * auVar179._8_4_;
              auVar77._12_4_ = fVar123 * auVar179._12_4_;
              auVar78 = vfmadd231ps_fma(auVar77,auVar74,auVar132);
              local_6c0._0_16_ = auVar78;
              auVar9 = vsubps_avx(auVar9,auVar78);
              _local_800 = auVar9;
              auVar9 = vdpps_avx(auVar9,auVar9,0x7f);
              fVar92 = auVar9._0_4_;
              if (fVar92 < 0.0) {
                local_9a0._0_16_ = ZEXT416((uint)fVar126);
                local_a60._0_16_ = auVar74;
                local_a80._0_16_ = auVar179;
                auVar229._0_4_ = sqrtf(fVar92);
                auVar229._4_60_ = extraout_var_00;
                auVar227 = ZEXT1664(auVar221);
                auVar78 = auVar229._0_16_;
                uVar59 = extraout_RAX_04;
                auVar179 = local_a80._0_16_;
                auVar74 = local_a60._0_16_;
                auVar70 = local_9a0._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar9,auVar9);
                auVar70 = ZEXT416((uint)fVar126);
              }
              auVar179 = vsubps_avx(auVar179,auVar74);
              auVar212._0_4_ = auVar179._0_4_ * 3.0;
              auVar212._4_4_ = auVar179._4_4_ * 3.0;
              auVar212._8_4_ = auVar179._8_4_ * 3.0;
              auVar212._12_4_ = auVar179._12_4_ * 3.0;
              auVar179 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar70,local_980._0_16_);
              auVar74 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_980._0_16_,auVar70);
              fVar121 = auVar70._0_4_ * 6.0;
              fVar122 = auVar179._0_4_ * 6.0;
              fVar123 = auVar74._0_4_ * 6.0;
              fVar126 = local_980._0_4_ * 6.0;
              auVar158._0_4_ = fVar126 * (float)local_a10._0_4_;
              auVar158._4_4_ = fVar126 * (float)local_a10._4_4_;
              auVar158._8_4_ = fVar126 * fStack_a08;
              auVar158._12_4_ = fVar126 * fStack_a04;
              auVar105._4_4_ = fVar123;
              auVar105._0_4_ = fVar123;
              auVar105._8_4_ = fVar123;
              auVar105._12_4_ = fVar123;
              auVar179 = vfmadd132ps_fma(auVar105,auVar158,local_9f0);
              auVar159._4_4_ = fVar122;
              auVar159._0_4_ = fVar122;
              auVar159._8_4_ = fVar122;
              auVar159._12_4_ = fVar122;
              auVar179 = vfmadd132ps_fma(auVar159,auVar179,local_a00);
              auVar74 = vdpps_avx(auVar212,auVar212,0x7f);
              auVar106._4_4_ = fVar121;
              auVar106._0_4_ = fVar121;
              auVar106._8_4_ = fVar121;
              auVar106._12_4_ = fVar121;
              auVar69 = vfmadd132ps_fma(auVar106,auVar179,local_9e0);
              auVar179 = vblendps_avx(auVar74,_DAT_01f45a50,0xe);
              auVar70 = vrsqrtss_avx(auVar179,auVar179);
              fVar123 = auVar74._0_4_;
              fVar121 = auVar70._0_4_;
              auVar70 = vdpps_avx(auVar212,auVar69,0x7f);
              fVar121 = fVar121 * 1.5 + fVar123 * -0.5 * fVar121 * fVar121 * fVar121;
              auVar107._0_4_ = auVar69._0_4_ * fVar123;
              auVar107._4_4_ = auVar69._4_4_ * fVar123;
              auVar107._8_4_ = auVar69._8_4_ * fVar123;
              auVar107._12_4_ = auVar69._12_4_ * fVar123;
              fVar122 = auVar70._0_4_;
              auVar200._0_4_ = auVar212._0_4_ * fVar122;
              auVar200._4_4_ = auVar212._4_4_ * fVar122;
              auVar200._8_4_ = auVar212._8_4_ * fVar122;
              auVar200._12_4_ = auVar212._12_4_ * fVar122;
              auVar70 = vsubps_avx(auVar107,auVar200);
              auVar179 = vrcpss_avx(auVar179,auVar179);
              auVar69 = vfnmadd213ss_fma(auVar179,auVar74,ZEXT416(0x40000000));
              fVar122 = auVar179._0_4_ * auVar69._0_4_;
              auVar179 = vmaxss_avx(ZEXT416((uint)local_8c0._0_4_),
                                    ZEXT416((uint)(auVar227._0_4_ * (float)local_840._0_4_)));
              uVar47 = CONCAT44(auVar212._4_4_,auVar212._0_4_);
              auVar237._0_8_ = uVar47 ^ 0x8000000080000000;
              auVar237._8_4_ = -auVar212._8_4_;
              auVar237._12_4_ = -auVar212._12_4_;
              auVar160._0_4_ = fVar121 * auVar70._0_4_ * fVar122;
              auVar160._4_4_ = fVar121 * auVar70._4_4_ * fVar122;
              auVar160._8_4_ = fVar121 * auVar70._8_4_ * fVar122;
              auVar160._12_4_ = fVar121 * auVar70._12_4_ * fVar122;
              local_820._0_4_ = auVar212._0_4_ * fVar121;
              local_820._4_4_ = auVar212._4_4_ * fVar121;
              local_820._8_4_ = auVar212._8_4_ * fVar121;
              local_820._12_4_ = auVar212._12_4_ * fVar121;
              local_980._0_16_ = auVar212;
              local_9a0._0_4_ = auVar179._0_4_;
              if (fVar123 < -fVar123) {
                local_a60._0_4_ = auVar78._0_4_;
                local_a80._0_16_ = auVar237;
                local_920._0_16_ = auVar160;
                fVar121 = sqrtf(fVar123);
                auVar78 = ZEXT416((uint)local_a60._0_4_);
                auVar179 = ZEXT416((uint)local_9a0._0_4_);
                uVar59 = extraout_RAX_05;
                auVar160 = local_920._0_16_;
                auVar237 = local_a80._0_16_;
              }
              else {
                auVar74 = vsqrtss_avx(auVar74,auVar74);
                fVar121 = auVar74._0_4_;
              }
              local_a60._0_16_ = vdpps_avx(_local_800,local_820._0_16_,0x7f);
              auVar69 = vfmadd213ss_fma(ZEXT416((uint)local_8c0._0_4_),auVar78,auVar179);
              auVar179 = vdpps_avx(auVar237,local_820._0_16_,0x7f);
              auVar74 = vdpps_avx(_local_800,auVar160,0x7f);
              auVar70 = vdpps_avx(local_880._0_16_,local_820._0_16_,0x7f);
              auVar78 = vfmadd213ss_fma(ZEXT416((uint)(auVar78._0_4_ + 1.0)),
                                        ZEXT416((uint)((float)local_8c0._0_4_ / fVar121)),auVar69);
              local_a80._0_4_ = auVar78._0_4_;
              auVar79._0_4_ = local_a60._0_4_ * local_a60._0_4_;
              auVar79._4_4_ = local_a60._4_4_ * local_a60._4_4_;
              auVar79._8_4_ = local_a60._8_4_ * local_a60._8_4_;
              auVar79._12_4_ = local_a60._12_4_ * local_a60._12_4_;
              auVar78 = vdpps_avx(_local_800,auVar237,0x7f);
              auVar130 = vsubps_avx(auVar9,auVar79);
              auVar69 = vrsqrtss_avx(auVar130,auVar130);
              fVar122 = auVar130._0_4_;
              fVar121 = auVar69._0_4_;
              fVar121 = fVar121 * 1.5 + fVar122 * -0.5 * fVar121 * fVar121 * fVar121;
              auVar69 = vdpps_avx(_local_800,local_880._0_16_,0x7f);
              local_820._0_16_ = ZEXT416((uint)(auVar179._0_4_ + auVar74._0_4_));
              auVar179 = vfnmadd231ss_fma(auVar78,local_a60._0_16_,local_820._0_16_);
              auVar74 = vfnmadd231ss_fma(auVar69,local_a60._0_16_,auVar70);
              if (fVar122 < 0.0) {
                local_920._0_16_ = auVar70;
                local_6e0._0_16_ = auVar179;
                local_700._0_4_ = fVar121;
                local_720._0_16_ = auVar74;
                fVar122 = sqrtf(fVar122);
                uVar59 = extraout_RAX_06;
                fVar121 = (float)local_700._0_4_;
                auVar74 = local_720._0_16_;
                auVar70 = local_920._0_16_;
                auVar179 = local_6e0._0_16_;
              }
              else {
                auVar78 = vsqrtss_avx(auVar130,auVar130);
                fVar122 = auVar78._0_4_;
              }
              auVar245 = ZEXT1664(auVar9);
              auVar229 = ZEXT3264(local_8e0);
              auVar243 = ZEXT3264(local_900);
              auVar262 = ZEXT3264(local_a40);
              auVar78 = vpermilps_avx(local_6c0._0_16_,0xff);
              fVar122 = fVar122 - auVar78._0_4_;
              auVar78 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xff);
              auVar179 = vfmsub213ss_fma(auVar179,ZEXT416((uint)fVar121),auVar78);
              auVar161._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
              auVar161._8_4_ = auVar70._8_4_ ^ 0x80000000;
              auVar161._12_4_ = auVar70._12_4_ ^ 0x80000000;
              auVar180._0_8_ = auVar179._0_8_ ^ 0x8000000080000000;
              auVar180._8_4_ = auVar179._8_4_ ^ 0x80000000;
              auVar180._12_4_ = auVar179._12_4_ ^ 0x80000000;
              auVar69 = ZEXT416((uint)(auVar74._0_4_ * fVar121));
              auVar74 = vfmsub231ss_fma(ZEXT416((uint)(auVar179._0_4_ * auVar70._0_4_)),
                                        local_820._0_16_,auVar69);
              auVar179 = vinsertps_avx(auVar180,auVar69,0x1c);
              uVar65 = auVar74._0_4_;
              auVar181._4_4_ = uVar65;
              auVar181._0_4_ = uVar65;
              auVar181._8_4_ = uVar65;
              auVar181._12_4_ = uVar65;
              auVar179 = vdivps_avx(auVar179,auVar181);
              auVar74 = vinsertps_avx(local_820._0_16_,auVar161,0x10);
              auVar74 = vdivps_avx(auVar74,auVar181);
              fVar121 = local_a60._0_4_;
              auVar133._0_4_ = fVar121 * auVar179._0_4_ + fVar122 * auVar74._0_4_;
              auVar133._4_4_ = fVar121 * auVar179._4_4_ + fVar122 * auVar74._4_4_;
              auVar133._8_4_ = fVar121 * auVar179._8_4_ + fVar122 * auVar74._8_4_;
              auVar133._12_4_ = fVar121 * auVar179._12_4_ + fVar122 * auVar74._12_4_;
              auVar74 = vsubps_avx(auVar221,auVar133);
              auVar227 = ZEXT1664(auVar74);
              auVar179 = vandps_avx(local_a60._0_16_,local_a20);
              if (auVar179._0_4_ < (float)local_a80._0_4_) {
                auVar221 = vfmadd231ss_fma(ZEXT416((uint)((float)local_a80._0_4_ +
                                                         (float)local_9a0._0_4_)),local_740._0_16_,
                                           ZEXT416(0x36000000));
                auVar179 = vandps_avx(ZEXT416((uint)fVar122),local_a20);
                if (auVar179._0_4_ < auVar221._0_4_) {
                  bVar64 = uVar62 < 5;
                  fVar121 = auVar74._0_4_ + (float)local_7d0._0_4_;
                  bVar55 = 0;
                  if (((ray->org).field_0.m128[3] <= fVar121) &&
                     (fVar122 = ray->tfar, fVar121 <= fVar122)) {
                    auVar179 = vmovshdup_avx(auVar74);
                    fVar123 = auVar179._0_4_;
                    bVar55 = 0;
                    if ((0.0 <= fVar123) && (bVar55 = 0, fVar123 <= 1.0)) {
                      auVar179 = vrsqrtss_avx(auVar9,auVar9);
                      fVar126 = auVar179._0_4_;
                      pGVar5 = (context->scene->geometries).items[uVar60].ptr;
                      if ((pGVar5->mask & ray->mask) == 0) {
                        bVar55 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (bVar55 = 1, pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar92 = fVar126 * 1.5 + fVar92 * -0.5 * fVar126 * fVar126 * fVar126;
                        auVar162._0_4_ = fVar92 * (float)local_800._0_4_;
                        auVar162._4_4_ = fVar92 * (float)local_800._4_4_;
                        auVar162._8_4_ = fVar92 * fStack_7f8;
                        auVar162._12_4_ = fVar92 * fStack_7f4;
                        auVar70 = vfmadd213ps_fma(auVar78,auVar162,local_980._0_16_);
                        auVar179 = vshufps_avx(auVar162,auVar162,0xc9);
                        auVar78 = vshufps_avx(local_980._0_16_,local_980._0_16_,0xc9);
                        auVar163._0_4_ = auVar162._0_4_ * auVar78._0_4_;
                        auVar163._4_4_ = auVar162._4_4_ * auVar78._4_4_;
                        auVar163._8_4_ = auVar162._8_4_ * auVar78._8_4_;
                        auVar163._12_4_ = auVar162._12_4_ * auVar78._12_4_;
                        auVar221 = vfmsub231ps_fma(auVar163,local_980._0_16_,auVar179);
                        auVar179 = vshufps_avx(auVar221,auVar221,0xc9);
                        auVar78 = vshufps_avx(auVar70,auVar70,0xc9);
                        auVar221 = vshufps_avx(auVar221,auVar221,0xd2);
                        auVar80._0_4_ = auVar70._0_4_ * auVar221._0_4_;
                        auVar80._4_4_ = auVar70._4_4_ * auVar221._4_4_;
                        auVar80._8_4_ = auVar70._8_4_ * auVar221._8_4_;
                        auVar80._12_4_ = auVar70._12_4_ * auVar221._12_4_;
                        auVar78 = vfmsub231ps_fma(auVar80,auVar179,auVar78);
                        auVar179 = vshufps_avx(auVar78,auVar78,0xe9);
                        local_950 = vmovlps_avx(auVar179);
                        local_948 = auVar78._0_4_;
                        local_940 = 0;
                        local_934 = context->user->instID[0];
                        local_930 = context->user->instPrimID[0];
                        ray->tfar = fVar121;
                        local_a84 = -1;
                        local_9d0.valid = &local_a84;
                        local_9d0.geometryUserPtr = pGVar5->userPtr;
                        local_9d0.context = context->user;
                        local_9d0.hit = (RTCHitN *)&local_950;
                        local_9d0.N = 1;
                        local_9d0.ray = (RTCRayN *)ray;
                        local_944 = fVar123;
                        local_93c = uVar1;
                        local_938 = uVar60;
                        if (pGVar5->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_010eb682:
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar227 = ZEXT1664(auVar227._0_16_);
                            auVar245 = ZEXT1664(auVar245._0_16_);
                            (*p_Var6)(&local_9d0);
                            if (*local_9d0.valid == 0) goto LAB_010eb6cb;
                          }
                          bVar55 = 1;
                        }
                        else {
                          auVar227 = ZEXT1664(auVar74);
                          auVar245 = ZEXT1664(auVar9);
                          (*pGVar5->occlusionFilterN)(&local_9d0);
                          if (*local_9d0.valid != 0) goto LAB_010eb682;
LAB_010eb6cb:
                          ray->tfar = fVar122;
                          bVar55 = 0;
                        }
                        auVar229 = ZEXT3264(local_8e0);
                        auVar243 = ZEXT3264(local_900);
                        auVar262 = ZEXT3264(local_a40);
                      }
                    }
                  }
                  goto LAB_010eb486;
                }
              }
              uVar62 = uVar62 + 1;
            }
            bVar64 = false;
LAB_010eb486:
            bVar63 = bVar63 | bVar64 & bVar55;
            fVar92 = ray->tfar;
            auVar90._4_4_ = fVar92;
            auVar90._0_4_ = fVar92;
            auVar90._8_4_ = fVar92;
            auVar90._12_4_ = fVar92;
            auVar90._16_4_ = fVar92;
            auVar90._20_4_ = fVar92;
            auVar90._24_4_ = fVar92;
            auVar90._28_4_ = fVar92;
            fVar121 = ray->tfar;
            auVar108 = vcmpps_avx(_local_760,auVar90,2);
          }
          auVar144._0_4_ = (float)local_660._0_4_ + local_4c0._0_4_;
          auVar144._4_4_ = (float)local_660._4_4_ + local_4c0._4_4_;
          auVar144._8_4_ = fStack_658 + local_4c0._8_4_;
          auVar144._12_4_ = fStack_654 + local_4c0._12_4_;
          auVar144._16_4_ = fStack_650 + local_4c0._16_4_;
          auVar144._20_4_ = fStack_64c + local_4c0._20_4_;
          auVar144._24_4_ = fStack_648 + local_4c0._24_4_;
          auVar144._28_4_ = fStack_644 + local_4c0._28_4_;
          auVar169._4_4_ = fVar121;
          auVar169._0_4_ = fVar121;
          auVar169._8_4_ = fVar121;
          auVar169._12_4_ = fVar121;
          auVar169._16_4_ = fVar121;
          auVar169._20_4_ = fVar121;
          auVar169._24_4_ = fVar121;
          auVar169._28_4_ = fVar121;
          auVar222 = vcmpps_avx(auVar144,auVar169,2);
          auVar108 = vandps_avx(local_5a0,local_580);
          auVar108 = vandps_avx(auVar222,auVar108);
          auVar190._0_4_ = (float)local_660._0_4_ + local_500._0_4_;
          auVar190._4_4_ = (float)local_660._4_4_ + local_500._4_4_;
          auVar190._8_4_ = fStack_658 + local_500._8_4_;
          auVar190._12_4_ = fStack_654 + local_500._12_4_;
          auVar190._16_4_ = fStack_650 + local_500._16_4_;
          auVar190._20_4_ = fStack_64c + local_500._20_4_;
          auVar190._24_4_ = fStack_648 + local_500._24_4_;
          auVar190._28_4_ = fStack_644 + local_500._28_4_;
          auVar109 = vcmpps_avx(auVar190,auVar169,2);
          auVar222 = vandps_avx(local_7a0,_local_780);
          auVar222 = vandps_avx(auVar109,auVar222);
          auVar222 = vorps_avx(auVar108,auVar222);
          if ((((((((auVar222 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar222 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar222 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar222 >> 0x7f,0) != '\0') ||
                (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar222 >> 0xbf,0) != '\0') ||
              (auVar222 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar222[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar57 * 0x60) = auVar222;
            auVar108 = vblendvps_avx(_local_500,local_4c0,auVar108);
            *(undefined1 (*) [32])(auStack_160 + uVar57 * 0x60) = auVar108;
            uVar59 = vmovlps_avx(local_510);
            (&uStack_140)[uVar57 * 0xc] = uVar59;
            aiStack_138[uVar57 * 0x18] = local_b4c + 1;
            uVar57 = (ulong)((int)uVar57 + 1);
          }
          auVar229 = ZEXT3264(auVar229._0_32_);
          auVar252 = ZEXT3264(auVar243._0_32_);
          auVar268 = ZEXT3264(auVar262._0_32_);
          auVar262 = ZEXT3264(local_860);
          goto LAB_010ea2ca;
        }
      }
      auVar262 = ZEXT3264(local_860);
      auVar268 = ZEXT3264(local_a40);
      auVar252 = ZEXT3264(local_900);
      auVar229 = ZEXT3264(local_8e0);
    }
LAB_010ea2ca:
    auVar222 = local_360;
    fVar121 = ray->tfar;
    fVar92 = ray->tfar;
    auVar140._4_4_ = fVar92;
    auVar140._0_4_ = fVar92;
    auVar140._8_4_ = fVar92;
    auVar140._12_4_ = fVar92;
    auVar140._16_4_ = fVar92;
    auVar140._20_4_ = fVar92;
    auVar140._24_4_ = fVar92;
    auVar140._28_4_ = fVar92;
    while( true ) {
      uVar56 = (uint)uVar57;
      if (uVar56 == 0) {
        if (bVar63 != 0) goto LAB_010eb8dc;
        auVar81._4_4_ = fVar121;
        auVar81._0_4_ = fVar121;
        auVar81._8_4_ = fVar121;
        auVar81._12_4_ = fVar121;
        auVar9 = vcmpps_avx(local_520,auVar81,2);
        uVar60 = vmovmskps_avx(auVar9);
        uVar60 = (uint)local_7b0 & uVar60;
        goto LAB_010e9480;
      }
      uVar57 = (ulong)(uVar56 - 1);
      lVar58 = uVar57 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar58);
      auVar116._0_4_ = auVar108._0_4_ + (float)local_660._0_4_;
      auVar116._4_4_ = auVar108._4_4_ + (float)local_660._4_4_;
      auVar116._8_4_ = auVar108._8_4_ + fStack_658;
      auVar116._12_4_ = auVar108._12_4_ + fStack_654;
      auVar116._16_4_ = auVar108._16_4_ + fStack_650;
      auVar116._20_4_ = auVar108._20_4_ + fStack_64c;
      auVar116._24_4_ = auVar108._24_4_ + fStack_648;
      auVar116._28_4_ = auVar108._28_4_ + fStack_644;
      auVar115 = vcmpps_avx(auVar116,auVar140,2);
      auVar109 = vandps_avx(auVar115,*(undefined1 (*) [32])(auStack_180 + lVar58));
      local_4c0 = auVar109;
      auVar115 = *(undefined1 (*) [32])(auStack_180 + lVar58) & auVar115;
      if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar115 >> 0x7f,0) != '\0') ||
            (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0xbf,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar115[0x1f] < '\0') break;
      uVar57 = (ulong)(uVar56 - 1);
    }
    auVar84._8_4_ = 0x7f800000;
    auVar84._0_8_ = 0x7f8000007f800000;
    auVar84._12_4_ = 0x7f800000;
    auVar84._16_4_ = 0x7f800000;
    auVar84._20_4_ = 0x7f800000;
    auVar84._24_4_ = 0x7f800000;
    auVar84._28_4_ = 0x7f800000;
    auVar108 = vblendvps_avx(auVar84,auVar108,auVar109);
    auVar115 = vshufps_avx(auVar108,auVar108,0xb1);
    auVar115 = vminps_avx(auVar108,auVar115);
    auVar114 = vshufpd_avx(auVar115,auVar115,5);
    auVar115 = vminps_avx(auVar115,auVar114);
    auVar114 = vpermpd_avx2(auVar115,0x4e);
    auVar115 = vminps_avx(auVar115,auVar114);
    auVar108 = vcmpps_avx(auVar108,auVar115,0);
    auVar115 = auVar109 & auVar108;
    if ((((((((auVar115 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar115 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar115 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar115 >> 0x7f,0) != '\0') ||
          (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar115 >> 0xbf,0) != '\0') ||
        (auVar115 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar115[0x1f] < '\0') {
      auVar109 = vandps_avx(auVar108,auVar109);
    }
    uVar61 = vmovmskps_avx(auVar109);
    iVar13 = 0;
    for (; (uVar61 & 1) == 0; uVar61 = uVar61 >> 1 | 0x80000000) {
      iVar13 = iVar13 + 1;
    }
    *(undefined4 *)(local_4c0 + (uint)(iVar13 << 2)) = 0;
    uVar59 = (&uStack_140)[uVar57 * 0xc];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = uVar59;
    local_b4c = aiStack_138[uVar57 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar58) = local_4c0;
    uVar61 = uVar56 - 1;
    if ((((((((local_4c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_4c0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_4c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_4c0 >> 0x7f,0) != '\0') ||
          (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_4c0 >> 0xbf,0) != '\0') ||
        (local_4c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_4c0[0x1f] < '\0') {
      uVar61 = uVar56;
    }
    uVar65 = (undefined4)uVar59;
    auVar117._4_4_ = uVar65;
    auVar117._0_4_ = uVar65;
    auVar117._8_4_ = uVar65;
    auVar117._12_4_ = uVar65;
    auVar117._16_4_ = uVar65;
    auVar117._20_4_ = uVar65;
    auVar117._24_4_ = uVar65;
    auVar117._28_4_ = uVar65;
    auVar9 = vmovshdup_avx(auVar72);
    auVar9 = vsubps_avx(auVar9,auVar72);
    auVar85._0_4_ = auVar9._0_4_;
    auVar85._4_4_ = auVar85._0_4_;
    auVar85._8_4_ = auVar85._0_4_;
    auVar85._12_4_ = auVar85._0_4_;
    auVar85._16_4_ = auVar85._0_4_;
    auVar85._20_4_ = auVar85._0_4_;
    auVar85._24_4_ = auVar85._0_4_;
    auVar85._28_4_ = auVar85._0_4_;
    auVar9 = vfmadd132ps_fma(auVar85,auVar117,_DAT_01f7b040);
    _local_500 = ZEXT1632(auVar9);
    local_510._8_8_ = 0;
    local_510._0_8_ = *(ulong *)(local_500 + (uint)(iVar13 << 2));
    uVar57 = (ulong)uVar61;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }